

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar36;
  undefined8 in_R10;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  float fVar102;
  float fVar107;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float t1;
  undefined4 uVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vfloat4 b0;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vfloat4 b0_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  vfloat4 a0_3;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  vfloat4 a0_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar179 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar206;
  float fVar208;
  float fVar210;
  undefined1 auVar197 [16];
  float fVar207;
  float fVar209;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar211;
  float fVar212;
  float fVar221;
  float fVar222;
  vfloat4 a0_1;
  undefined1 auVar213 [16];
  float fVar223;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  vfloat4 a0;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [8];
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar32;
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar231 [32];
  
  uVar31 = (ulong)(byte)prim[1];
  fVar211 = *(float *)(prim + uVar31 * 0x19 + 0x12);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar46 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar112 = vsubps_avx(auVar44,*(undefined1 (*) [16])(prim + uVar31 * 0x19 + 6));
  fVar121 = fVar211 * auVar112._0_4_;
  fVar102 = fVar211 * auVar46._0_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar31 * 4 + 6);
  auVar75 = vpmovsxbd_avx2(auVar44);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar31 * 5 + 6);
  auVar73 = vpmovsxbd_avx2(auVar54);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar31 * 6 + 6);
  auVar74 = vpmovsxbd_avx2(auVar4);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar31 * 0xb + 6);
  auVar85 = vpmovsxbd_avx2(auVar53);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar31 * 0xc + 6);
  auVar86 = vpmovsxbd_avx2(auVar52);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar31 * 0xd + 6);
  auVar76 = vpmovsxbd_avx2(auVar51);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar31 * 0x12 + 6);
  auVar77 = vpmovsxbd_avx2(auVar5);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar31 * 0x13 + 6);
  auVar80 = vpmovsxbd_avx2(auVar50);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar31 * 0x14 + 6);
  auVar71 = vpmovsxbd_avx2(auVar6);
  auVar78 = vcvtdq2ps_avx(auVar80);
  auVar79 = vcvtdq2ps_avx(auVar71);
  auVar131._4_4_ = fVar102;
  auVar131._0_4_ = fVar102;
  auVar131._8_4_ = fVar102;
  auVar131._12_4_ = fVar102;
  auVar131._16_4_ = fVar102;
  auVar131._20_4_ = fVar102;
  auVar131._24_4_ = fVar102;
  auVar131._28_4_ = fVar102;
  auVar237._8_4_ = 1;
  auVar237._0_8_ = 0x100000001;
  auVar237._12_4_ = 1;
  auVar237._16_4_ = 1;
  auVar237._20_4_ = 1;
  auVar237._24_4_ = 1;
  auVar237._28_4_ = 1;
  auVar81 = ZEXT1632(CONCAT412(fVar211 * auVar46._12_4_,
                               CONCAT48(fVar211 * auVar46._8_4_,
                                        CONCAT44(fVar211 * auVar46._4_4_,fVar102))));
  auVar72 = vpermps_avx2(auVar237,auVar81);
  auVar69 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar245 = ZEXT3264(auVar69);
  auVar70 = vpermps_avx512vl(auVar69,auVar81);
  fVar102 = auVar70._0_4_;
  fVar207 = auVar70._4_4_;
  auVar81._4_4_ = fVar207 * auVar74._4_4_;
  auVar81._0_4_ = fVar102 * auVar74._0_4_;
  fVar209 = auVar70._8_4_;
  auVar81._8_4_ = fVar209 * auVar74._8_4_;
  fVar107 = auVar70._12_4_;
  auVar81._12_4_ = fVar107 * auVar74._12_4_;
  fVar108 = auVar70._16_4_;
  auVar81._16_4_ = fVar108 * auVar74._16_4_;
  fVar109 = auVar70._20_4_;
  auVar81._20_4_ = fVar109 * auVar74._20_4_;
  fVar110 = auVar70._24_4_;
  auVar81._24_4_ = fVar110 * auVar74._24_4_;
  auVar81._28_4_ = auVar71._28_4_;
  auVar71._4_4_ = auVar76._4_4_ * fVar207;
  auVar71._0_4_ = auVar76._0_4_ * fVar102;
  auVar71._8_4_ = auVar76._8_4_ * fVar209;
  auVar71._12_4_ = auVar76._12_4_ * fVar107;
  auVar71._16_4_ = auVar76._16_4_ * fVar108;
  auVar71._20_4_ = auVar76._20_4_ * fVar109;
  auVar71._24_4_ = auVar76._24_4_ * fVar110;
  auVar71._28_4_ = auVar80._28_4_;
  auVar80._4_4_ = auVar79._4_4_ * fVar207;
  auVar80._0_4_ = auVar79._0_4_ * fVar102;
  auVar80._8_4_ = auVar79._8_4_ * fVar209;
  auVar80._12_4_ = auVar79._12_4_ * fVar107;
  auVar80._16_4_ = auVar79._16_4_ * fVar108;
  auVar80._20_4_ = auVar79._20_4_ * fVar109;
  auVar80._24_4_ = auVar79._24_4_ * fVar110;
  auVar80._28_4_ = auVar70._28_4_;
  auVar44 = vfmadd231ps_fma(auVar81,auVar72,auVar73);
  auVar54 = vfmadd231ps_fma(auVar71,auVar72,auVar86);
  auVar4 = vfmadd231ps_fma(auVar80,auVar78,auVar72);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar131,auVar75);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar131,auVar85);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar77,auVar131);
  auVar144._4_4_ = fVar121;
  auVar144._0_4_ = fVar121;
  auVar144._8_4_ = fVar121;
  auVar144._12_4_ = fVar121;
  auVar144._16_4_ = fVar121;
  auVar144._20_4_ = fVar121;
  auVar144._24_4_ = fVar121;
  auVar144._28_4_ = fVar121;
  auVar71 = ZEXT1632(CONCAT412(fVar211 * auVar112._12_4_,
                               CONCAT48(fVar211 * auVar112._8_4_,
                                        CONCAT44(fVar211 * auVar112._4_4_,fVar121))));
  auVar80 = vpermps_avx2(auVar237,auVar71);
  auVar71 = vpermps_avx512vl(auVar69,auVar71);
  auVar72 = vmulps_avx512vl(auVar71,auVar74);
  auVar83._0_4_ = auVar71._0_4_ * auVar76._0_4_;
  auVar83._4_4_ = auVar71._4_4_ * auVar76._4_4_;
  auVar83._8_4_ = auVar71._8_4_ * auVar76._8_4_;
  auVar83._12_4_ = auVar71._12_4_ * auVar76._12_4_;
  auVar83._16_4_ = auVar71._16_4_ * auVar76._16_4_;
  auVar83._20_4_ = auVar71._20_4_ * auVar76._20_4_;
  auVar83._24_4_ = auVar71._24_4_ * auVar76._24_4_;
  auVar83._28_4_ = 0;
  auVar76._4_4_ = auVar71._4_4_ * auVar79._4_4_;
  auVar76._0_4_ = auVar71._0_4_ * auVar79._0_4_;
  auVar76._8_4_ = auVar71._8_4_ * auVar79._8_4_;
  auVar76._12_4_ = auVar71._12_4_ * auVar79._12_4_;
  auVar76._16_4_ = auVar71._16_4_ * auVar79._16_4_;
  auVar76._20_4_ = auVar71._20_4_ * auVar79._20_4_;
  auVar76._24_4_ = auVar71._24_4_ * auVar79._24_4_;
  auVar76._28_4_ = auVar74._28_4_;
  auVar73 = vfmadd231ps_avx512vl(auVar72,auVar80,auVar73);
  auVar53 = vfmadd231ps_fma(auVar83,auVar80,auVar86);
  auVar52 = vfmadd231ps_fma(auVar76,auVar80,auVar78);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar144,auVar75);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar144,auVar85);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar144,auVar77);
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  auVar75 = vandps_avx(ZEXT1632(auVar44),auVar87);
  auVar89._8_4_ = 0x219392ef;
  auVar89._0_8_ = 0x219392ef219392ef;
  auVar89._12_4_ = 0x219392ef;
  auVar89._16_4_ = 0x219392ef;
  auVar89._20_4_ = 0x219392ef;
  auVar89._24_4_ = 0x219392ef;
  auVar89._28_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar75,auVar89,1);
  bVar39 = (bool)((byte)uVar37 & 1);
  auVar72._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar44._0_4_;
  bVar39 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar44._4_4_;
  bVar39 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar44._8_4_;
  bVar39 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar44._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar75 = vandps_avx(ZEXT1632(auVar54),auVar87);
  uVar37 = vcmpps_avx512vl(auVar75,auVar89,1);
  bVar39 = (bool)((byte)uVar37 & 1);
  auVar69._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar54._0_4_;
  bVar39 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar54._4_4_;
  bVar39 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar54._8_4_;
  bVar39 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar54._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar75 = vandps_avx(ZEXT1632(auVar4),auVar87);
  uVar37 = vcmpps_avx512vl(auVar75,auVar89,1);
  bVar39 = (bool)((byte)uVar37 & 1);
  auVar75._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar4._0_4_;
  bVar39 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar4._4_4_;
  bVar39 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar4._8_4_;
  bVar39 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar4._12_4_;
  auVar75._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar75._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar75._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar75._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar44 = vfnmadd213ps_fma(auVar72,auVar74,auVar88);
  auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar69);
  auVar54 = vfnmadd213ps_fma(auVar69,auVar74,auVar88);
  auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar75);
  auVar4 = vfnmadd213ps_fma(auVar75,auVar74,auVar88);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar74,auVar74);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 7 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx512vl(auVar75,auVar73);
  auVar77._4_4_ = auVar44._4_4_ * auVar75._4_4_;
  auVar77._0_4_ = auVar44._0_4_ * auVar75._0_4_;
  auVar77._8_4_ = auVar44._8_4_ * auVar75._8_4_;
  auVar77._12_4_ = auVar44._12_4_ * auVar75._12_4_;
  auVar77._16_4_ = auVar75._16_4_ * 0.0;
  auVar77._20_4_ = auVar75._20_4_ * 0.0;
  auVar77._24_4_ = auVar75._24_4_ * 0.0;
  auVar77._28_4_ = auVar75._28_4_;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 9 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx512vl(auVar75,auVar73);
  auVar84._0_4_ = auVar44._0_4_ * auVar75._0_4_;
  auVar84._4_4_ = auVar44._4_4_ * auVar75._4_4_;
  auVar84._8_4_ = auVar44._8_4_ * auVar75._8_4_;
  auVar84._12_4_ = auVar44._12_4_ * auVar75._12_4_;
  auVar84._16_4_ = auVar75._16_4_ * 0.0;
  auVar84._20_4_ = auVar75._20_4_ * 0.0;
  auVar84._24_4_ = auVar75._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0xe + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar53));
  auVar78._4_4_ = auVar54._4_4_ * auVar75._4_4_;
  auVar78._0_4_ = auVar54._0_4_ * auVar75._0_4_;
  auVar78._8_4_ = auVar54._8_4_ * auVar75._8_4_;
  auVar78._12_4_ = auVar54._12_4_ * auVar75._12_4_;
  auVar78._16_4_ = auVar75._16_4_ * 0.0;
  auVar78._20_4_ = auVar75._20_4_ * 0.0;
  auVar78._24_4_ = auVar75._24_4_ * 0.0;
  auVar78._28_4_ = auVar75._28_4_;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar53));
  auVar82._0_4_ = auVar54._0_4_ * auVar75._0_4_;
  auVar82._4_4_ = auVar54._4_4_ * auVar75._4_4_;
  auVar82._8_4_ = auVar54._8_4_ * auVar75._8_4_;
  auVar82._12_4_ = auVar54._12_4_ * auVar75._12_4_;
  auVar82._16_4_ = auVar75._16_4_ * 0.0;
  auVar82._20_4_ = auVar75._20_4_ * 0.0;
  auVar82._24_4_ = auVar75._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x15 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar52));
  auVar79._4_4_ = auVar75._4_4_ * auVar4._4_4_;
  auVar79._0_4_ = auVar75._0_4_ * auVar4._0_4_;
  auVar79._8_4_ = auVar75._8_4_ * auVar4._8_4_;
  auVar79._12_4_ = auVar75._12_4_ * auVar4._12_4_;
  auVar79._16_4_ = auVar75._16_4_ * 0.0;
  auVar79._20_4_ = auVar75._20_4_ * 0.0;
  auVar79._24_4_ = auVar75._24_4_ * 0.0;
  auVar79._28_4_ = auVar75._28_4_;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x17 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar52));
  auVar70._0_4_ = auVar4._0_4_ * auVar75._0_4_;
  auVar70._4_4_ = auVar4._4_4_ * auVar75._4_4_;
  auVar70._8_4_ = auVar4._8_4_ * auVar75._8_4_;
  auVar70._12_4_ = auVar4._12_4_ * auVar75._12_4_;
  auVar70._16_4_ = auVar75._16_4_ * 0.0;
  auVar70._20_4_ = auVar75._20_4_ * 0.0;
  auVar70._24_4_ = auVar75._24_4_ * 0.0;
  auVar70._28_4_ = 0;
  auVar75 = vpminsd_avx2(auVar77,auVar84);
  auVar73 = vpminsd_avx2(auVar78,auVar82);
  auVar75 = vmaxps_avx(auVar75,auVar73);
  auVar73 = vpminsd_avx2(auVar79,auVar70);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar74._4_4_ = uVar111;
  auVar74._0_4_ = uVar111;
  auVar74._8_4_ = uVar111;
  auVar74._12_4_ = uVar111;
  auVar74._16_4_ = uVar111;
  auVar74._20_4_ = uVar111;
  auVar74._24_4_ = uVar111;
  auVar74._28_4_ = uVar111;
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar75 = vmaxps_avx(auVar75,auVar73);
  auVar73._8_4_ = 0x3f7ffffa;
  auVar73._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar73._12_4_ = 0x3f7ffffa;
  auVar73._16_4_ = 0x3f7ffffa;
  auVar73._20_4_ = 0x3f7ffffa;
  auVar73._24_4_ = 0x3f7ffffa;
  auVar73._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar75,auVar73);
  auVar75 = vpmaxsd_avx2(auVar77,auVar84);
  auVar73 = vpmaxsd_avx2(auVar78,auVar82);
  auVar75 = vminps_avx(auVar75,auVar73);
  auVar73 = vpmaxsd_avx2(auVar79,auVar70);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar85._4_4_ = uVar111;
  auVar85._0_4_ = uVar111;
  auVar85._8_4_ = uVar111;
  auVar85._12_4_ = uVar111;
  auVar85._16_4_ = uVar111;
  auVar85._20_4_ = uVar111;
  auVar85._24_4_ = uVar111;
  auVar85._28_4_ = uVar111;
  auVar73 = vminps_avx512vl(auVar73,auVar85);
  auVar75 = vminps_avx(auVar75,auVar73);
  auVar86._8_4_ = 0x3f800003;
  auVar86._0_8_ = 0x3f8000033f800003;
  auVar86._12_4_ = 0x3f800003;
  auVar86._16_4_ = 0x3f800003;
  auVar86._20_4_ = 0x3f800003;
  auVar86._24_4_ = 0x3f800003;
  auVar86._28_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar86);
  auVar73 = vpbroadcastd_avx512vl();
  uVar17 = vcmpps_avx512vl(local_1c0,auVar75,2);
  uVar18 = vpcmpgtd_avx512vl(auVar73,_DAT_01fb4ba0);
  uVar37 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar17 & (byte)uVar18));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar238 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar240 = ZEXT1664(auVar44);
  auVar247 = ZEXT464(0x3f800000);
  auVar44 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar246 = ZEXT1664(auVar44);
LAB_019fd524:
  if (uVar37 == 0) {
LAB_019ff0e6:
    return uVar37 != 0;
  }
  lVar33 = 0;
  for (uVar31 = uVar37; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar33 = lVar33 + 1;
  }
  uVar7 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar33 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar44 = *(undefined1 (*) [16])(_Var12 + uVar31 * (long)pvVar11);
  auVar54 = *(undefined1 (*) [16])(_Var12 + (uVar31 + 1) * (long)pvVar11);
  auVar4 = *(undefined1 (*) [16])(_Var12 + (uVar31 + 2) * (long)pvVar11);
  auVar53 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar31 + 3));
  lVar33 = *(long *)&pGVar9[1].time_range.upper;
  auVar52 = *(undefined1 (*) [16])(lVar33 + (long)p_Var10 * uVar31);
  auVar51 = *(undefined1 (*) [16])(lVar33 + (long)p_Var10 * (uVar31 + 1));
  auVar5 = *(undefined1 (*) [16])(lVar33 + (long)p_Var10 * (uVar31 + 2));
  uVar38 = uVar37 - 1 & uVar37;
  auVar50 = *(undefined1 (*) [16])(lVar33 + (long)p_Var10 * (uVar31 + 3));
  if (uVar38 != 0) {
    uVar36 = uVar38 - 1 & uVar38;
    for (uVar31 = uVar38; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    }
    if (uVar36 != 0) {
      for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar55 = ZEXT816(0) << 0x40;
  auVar48._0_4_ = auVar50._0_4_ * 0.0;
  auVar48._4_4_ = auVar50._4_4_ * 0.0;
  auVar48._8_4_ = auVar50._8_4_ * 0.0;
  auVar48._12_4_ = auVar50._12_4_ * 0.0;
  auVar227._8_4_ = 0x3e2aaaab;
  auVar227._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar227._12_4_ = 0x3e2aaaab;
  auVar46 = vfmadd213ps_fma(auVar227,auVar5,auVar48);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar51,auVar45);
  auVar112 = vfmadd231ps_fma(auVar46,auVar52,auVar227);
  auVar56 = auVar238._0_16_;
  auVar46 = vfmadd231ps_avx512vl(auVar48,auVar5,auVar56);
  auVar46 = vfnmadd231ps_fma(auVar46,auVar51,auVar55);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar52,auVar56);
  auVar213._0_4_ = auVar53._0_4_ * 0.0;
  auVar213._4_4_ = auVar53._4_4_ * 0.0;
  auVar213._8_4_ = auVar53._8_4_ * 0.0;
  auVar213._12_4_ = auVar53._12_4_ * 0.0;
  auVar46 = vfmadd213ps_fma(auVar227,auVar4,auVar213);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar54,auVar45);
  auVar46 = vfmadd231ps_fma(auVar46,auVar44,auVar227);
  auVar48 = vfmadd231ps_avx512vl(auVar213,auVar4,auVar56);
  auVar48 = vfnmadd231ps_fma(auVar48,auVar54,auVar55);
  auVar49 = vfnmadd231ps_avx512vl(auVar48,auVar44,auVar56);
  auVar68._0_4_ = auVar50._0_4_ * 0.16666667;
  auVar68._4_4_ = auVar50._4_4_ * 0.16666667;
  auVar68._8_4_ = auVar50._8_4_ * 0.16666667;
  auVar68._12_4_ = auVar50._12_4_ * 0.16666667;
  auVar48 = vfmadd231ps_avx512vl(auVar68,auVar5,auVar45);
  auVar48 = vfmadd231ps_fma(auVar48,auVar51,auVar227);
  auVar48 = vfmadd231ps_fma(auVar48,auVar52,auVar55);
  auVar50 = vmulps_avx512vl(auVar50,auVar56);
  auVar5 = vfmadd231ps_fma(auVar50,auVar55,auVar5);
  auVar51 = vfnmadd231ps_avx512vl(auVar5,auVar56,auVar51);
  auVar5 = vfnmadd231ps_fma(auVar51,auVar55,auVar52);
  auVar175._0_4_ = auVar53._0_4_ * 0.16666667;
  auVar175._4_4_ = auVar53._4_4_ * 0.16666667;
  auVar175._8_4_ = auVar53._8_4_ * 0.16666667;
  auVar175._12_4_ = auVar53._12_4_ * 0.16666667;
  auVar52 = vfmadd231ps_avx512vl(auVar175,auVar4,auVar45);
  auVar52 = vfmadd231ps_fma(auVar52,auVar54,auVar227);
  auVar52 = vfmadd231ps_fma(auVar52,auVar44,auVar55);
  auVar53 = vmulps_avx512vl(auVar53,auVar56);
  auVar4 = vfmadd231ps_fma(auVar53,auVar55,auVar4);
  auVar54 = vfnmadd231ps_avx512vl(auVar4,auVar56,auVar54);
  auVar51 = vfnmadd231ps_fma(auVar54,auVar55,auVar44);
  auVar44 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar54 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar107 = auVar47._0_4_;
  auVar57._0_4_ = fVar107 * auVar54._0_4_;
  fVar108 = auVar47._4_4_;
  auVar57._4_4_ = fVar108 * auVar54._4_4_;
  fVar109 = auVar47._8_4_;
  auVar57._8_4_ = fVar109 * auVar54._8_4_;
  fVar110 = auVar47._12_4_;
  auVar57._12_4_ = fVar110 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar57,auVar44,auVar46);
  auVar4 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar58._0_4_ = fVar107 * auVar54._0_4_;
  auVar58._4_4_ = fVar108 * auVar54._4_4_;
  auVar58._8_4_ = fVar109 * auVar54._8_4_;
  auVar58._12_4_ = fVar110 * auVar54._12_4_;
  auVar44 = vfmsub231ps_fma(auVar58,auVar44,auVar49);
  auVar53 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar54 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar121 = auVar5._0_4_;
  auVar62._0_4_ = fVar121 * auVar54._0_4_;
  fVar134 = auVar5._4_4_;
  auVar62._4_4_ = fVar134 * auVar54._4_4_;
  fVar135 = auVar5._8_4_;
  auVar62._8_4_ = fVar135 * auVar54._8_4_;
  fVar136 = auVar5._12_4_;
  auVar62._12_4_ = fVar136 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar62,auVar44,auVar52);
  auVar52 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar176._0_4_ = auVar54._0_4_ * fVar121;
  auVar176._4_4_ = auVar54._4_4_ * fVar134;
  auVar176._8_4_ = auVar54._8_4_ * fVar135;
  auVar176._12_4_ = auVar54._12_4_ * fVar136;
  auVar44 = vfmsub231ps_fma(auVar176,auVar44,auVar51);
  auVar51 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar102 = auVar44._0_4_;
  auVar177._4_12_ = ZEXT812(0) << 0x20;
  auVar177._0_4_ = fVar102;
  auVar54 = vrsqrt14ss_avx512f(auVar55,auVar177);
  auVar50 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  fVar211 = auVar54._0_4_;
  fVar211 = auVar50._0_4_ + auVar46._0_4_ * fVar211 * fVar211 * fVar211;
  fVar212 = fVar211 * auVar4._0_4_;
  fVar221 = fVar211 * auVar4._4_4_;
  fVar222 = fVar211 * auVar4._8_4_;
  fVar223 = fVar211 * auVar4._12_4_;
  auVar54 = vdpps_avx(auVar4,auVar53,0x7f);
  auVar189._0_4_ = auVar53._0_4_ * fVar102;
  auVar189._4_4_ = auVar53._4_4_ * fVar102;
  auVar189._8_4_ = auVar53._8_4_ * fVar102;
  auVar189._12_4_ = auVar53._12_4_ * fVar102;
  fVar102 = auVar54._0_4_;
  auVar154._0_4_ = fVar102 * auVar4._0_4_;
  auVar154._4_4_ = fVar102 * auVar4._4_4_;
  auVar154._8_4_ = fVar102 * auVar4._8_4_;
  auVar154._12_4_ = fVar102 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar189,auVar154);
  auVar54 = vrcp14ss_avx512f(auVar55,auVar177);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar54,ZEXT416(0x40000000));
  fVar207 = auVar54._0_4_ * auVar44._0_4_;
  auVar44 = vdpps_avx(auVar52,auVar52,0x7f);
  fVar209 = auVar44._0_4_;
  auVar168._4_12_ = ZEXT812(0) << 0x20;
  auVar168._0_4_ = fVar209;
  auVar54 = vrsqrt14ss_avx512f(auVar55,auVar168);
  auVar53 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  fVar102 = auVar54._0_4_;
  fVar102 = auVar53._0_4_ + auVar50._0_4_ * fVar102 * fVar102 * fVar102;
  fVar196 = fVar102 * auVar52._0_4_;
  fVar206 = fVar102 * auVar52._4_4_;
  fVar208 = fVar102 * auVar52._8_4_;
  fVar210 = fVar102 * auVar52._12_4_;
  auVar54 = vdpps_avx(auVar52,auVar51,0x7f);
  auVar64._0_4_ = fVar209 * auVar51._0_4_;
  auVar64._4_4_ = fVar209 * auVar51._4_4_;
  auVar64._8_4_ = fVar209 * auVar51._8_4_;
  auVar64._12_4_ = fVar209 * auVar51._12_4_;
  fVar209 = auVar54._0_4_;
  auVar137._0_4_ = fVar209 * auVar52._0_4_;
  auVar137._4_4_ = fVar209 * auVar52._4_4_;
  auVar137._8_4_ = fVar209 * auVar52._8_4_;
  auVar137._12_4_ = fVar209 * auVar52._12_4_;
  auVar53 = vsubps_avx(auVar64,auVar137);
  auVar54 = vrcp14ss_avx512f(auVar55,auVar168);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar54,ZEXT416(0x40000000));
  fVar209 = auVar44._0_4_ * auVar54._0_4_;
  auVar44 = vshufps_avx(auVar112,auVar112,0xff);
  auVar169._0_4_ = fVar212 * auVar44._0_4_;
  auVar169._4_4_ = fVar221 * auVar44._4_4_;
  auVar169._8_4_ = fVar222 * auVar44._8_4_;
  auVar169._12_4_ = fVar223 * auVar44._12_4_;
  local_350 = vsubps_avx(auVar112,auVar169);
  auVar54 = vshufps_avx(auVar47,auVar47,0xff);
  auVar66._0_4_ = auVar54._0_4_ * fVar212 + auVar44._0_4_ * fVar211 * fVar207 * auVar4._0_4_;
  auVar66._4_4_ = auVar54._4_4_ * fVar221 + auVar44._4_4_ * fVar211 * fVar207 * auVar4._4_4_;
  auVar66._8_4_ = auVar54._8_4_ * fVar222 + auVar44._8_4_ * fVar211 * fVar207 * auVar4._8_4_;
  auVar66._12_4_ = auVar54._12_4_ * fVar223 + auVar44._12_4_ * fVar211 * fVar207 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar47,auVar66);
  local_360._0_4_ = auVar169._0_4_ + auVar112._0_4_;
  local_360._4_4_ = auVar169._4_4_ + auVar112._4_4_;
  fStack_358 = auVar169._8_4_ + auVar112._8_4_;
  fStack_354 = auVar169._12_4_ + auVar112._12_4_;
  auVar44 = vshufps_avx(auVar48,auVar48,0xff);
  auVar67._0_4_ = fVar196 * auVar44._0_4_;
  auVar67._4_4_ = fVar206 * auVar44._4_4_;
  auVar67._8_4_ = fVar208 * auVar44._8_4_;
  auVar67._12_4_ = fVar210 * auVar44._12_4_;
  local_370 = vsubps_avx(auVar48,auVar67);
  auVar54 = vshufps_avx(auVar5,auVar5,0xff);
  auVar49._0_4_ = auVar54._0_4_ * fVar196 + auVar44._0_4_ * fVar102 * auVar53._0_4_ * fVar209;
  auVar49._4_4_ = auVar54._4_4_ * fVar206 + auVar44._4_4_ * fVar102 * auVar53._4_4_ * fVar209;
  auVar49._8_4_ = auVar54._8_4_ * fVar208 + auVar44._8_4_ * fVar102 * auVar53._8_4_ * fVar209;
  auVar49._12_4_ = auVar54._12_4_ * fVar210 + auVar44._12_4_ * fVar102 * auVar53._12_4_ * fVar209;
  auVar44 = vsubps_avx(auVar5,auVar49);
  _local_380 = vaddps_avx512vl(auVar48,auVar67);
  auVar59._0_4_ = auVar4._0_4_ * 0.33333334;
  auVar59._4_4_ = auVar4._4_4_ * 0.33333334;
  auVar59._8_4_ = auVar4._8_4_ * 0.33333334;
  auVar59._12_4_ = auVar4._12_4_ * 0.33333334;
  local_390 = vaddps_avx512vl(local_350,auVar59);
  auVar60._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar60._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar60._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar60._12_4_ = auVar44._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx512vl(local_370,auVar60);
  auVar112._0_4_ = (fVar107 + auVar66._0_4_) * 0.33333334;
  auVar112._4_4_ = (fVar108 + auVar66._4_4_) * 0.33333334;
  auVar112._8_4_ = (fVar109 + auVar66._8_4_) * 0.33333334;
  auVar112._12_4_ = (fVar110 + auVar66._12_4_) * 0.33333334;
  _local_3b0 = vaddps_avx512vl(_local_360,auVar112);
  auVar45._0_4_ = (fVar121 + auVar49._0_4_) * 0.33333334;
  auVar45._4_4_ = (fVar134 + auVar49._4_4_) * 0.33333334;
  auVar45._8_4_ = (fVar135 + auVar49._8_4_) * 0.33333334;
  auVar45._12_4_ = (fVar136 + auVar49._12_4_) * 0.33333334;
  _local_3c0 = vsubps_avx512vl(_local_380,auVar45);
  local_2d0 = vsubps_avx(local_350,auVar6);
  uVar111 = local_2d0._0_4_;
  auVar56._4_4_ = uVar111;
  auVar56._0_4_ = uVar111;
  auVar56._8_4_ = uVar111;
  auVar56._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar54 = vshufps_avx(local_2d0,local_2d0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar211 = pre->ray_space[k].vz.field_0.m128[0];
  fVar102 = pre->ray_space[k].vz.field_0.m128[1];
  fVar207 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  auVar47._0_4_ = fVar211 * auVar54._0_4_;
  auVar47._4_4_ = fVar102 * auVar54._4_4_;
  auVar47._8_4_ = fVar207 * auVar54._8_4_;
  auVar47._12_4_ = fVar209 * auVar54._12_4_;
  auVar44 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar3,auVar44);
  auVar50 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar56);
  local_2e0 = vsubps_avx512vl(local_390,auVar6);
  uVar111 = local_2e0._0_4_;
  auVar63._4_4_ = uVar111;
  auVar63._0_4_ = uVar111;
  auVar63._8_4_ = uVar111;
  auVar63._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar54 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar65._0_4_ = fVar211 * auVar54._0_4_;
  auVar65._4_4_ = fVar102 * auVar54._4_4_;
  auVar65._8_4_ = fVar207 * auVar54._8_4_;
  auVar65._12_4_ = fVar209 * auVar54._12_4_;
  auVar44 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar3,auVar44);
  auVar46 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar63);
  local_2f0 = vsubps_avx512vl(local_3a0,auVar6);
  uVar111 = local_2f0._0_4_;
  auVar155._4_4_ = uVar111;
  auVar155._0_4_ = uVar111;
  auVar155._8_4_ = uVar111;
  auVar155._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar54 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar61._0_4_ = fVar211 * auVar54._0_4_;
  auVar61._4_4_ = fVar102 * auVar54._4_4_;
  auVar61._8_4_ = fVar207 * auVar54._8_4_;
  auVar61._12_4_ = fVar209 * auVar54._12_4_;
  auVar44 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar3,auVar44);
  auVar112 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar155);
  local_300 = vsubps_avx(local_370,auVar6);
  uVar111 = local_300._0_4_;
  auVar156._4_4_ = uVar111;
  auVar156._0_4_ = uVar111;
  auVar156._8_4_ = uVar111;
  auVar156._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_300,local_300,0x55);
  auVar54 = vshufps_avx(local_300,local_300,0xaa);
  auVar178._0_4_ = auVar54._0_4_ * fVar211;
  auVar178._4_4_ = auVar54._4_4_ * fVar102;
  auVar178._8_4_ = auVar54._8_4_ * fVar207;
  auVar178._12_4_ = auVar54._12_4_ * fVar209;
  auVar44 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar3,auVar44);
  auVar48 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar156);
  local_310 = vsubps_avx(_local_360,auVar6);
  uVar111 = local_310._0_4_;
  auVar157._4_4_ = uVar111;
  auVar157._0_4_ = uVar111;
  auVar157._8_4_ = uVar111;
  auVar157._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_310,local_310,0x55);
  auVar54 = vshufps_avx(local_310,local_310,0xaa);
  auVar190._0_4_ = auVar54._0_4_ * fVar211;
  auVar190._4_4_ = auVar54._4_4_ * fVar102;
  auVar190._8_4_ = auVar54._8_4_ * fVar207;
  auVar190._12_4_ = auVar54._12_4_ * fVar209;
  auVar44 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar3,auVar44);
  auVar45 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar157);
  local_320 = vsubps_avx512vl(_local_3b0,auVar6);
  uVar111 = local_320._0_4_;
  auVar158._4_4_ = uVar111;
  auVar158._0_4_ = uVar111;
  auVar158._8_4_ = uVar111;
  auVar158._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_320,local_320,0x55);
  auVar54 = vshufps_avx(local_320,local_320,0xaa);
  auVar197._0_4_ = auVar54._0_4_ * fVar211;
  auVar197._4_4_ = auVar54._4_4_ * fVar102;
  auVar197._8_4_ = auVar54._8_4_ * fVar207;
  auVar197._12_4_ = auVar54._12_4_ * fVar209;
  auVar44 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar3,auVar44);
  auVar47 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar158);
  local_330 = vsubps_avx512vl(_local_3c0,auVar6);
  uVar111 = local_330._0_4_;
  auVar159._4_4_ = uVar111;
  auVar159._0_4_ = uVar111;
  auVar159._8_4_ = uVar111;
  auVar159._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_330,local_330,0x55);
  auVar54 = vshufps_avx(local_330,local_330,0xaa);
  auVar214._0_4_ = auVar54._0_4_ * fVar211;
  auVar214._4_4_ = auVar54._4_4_ * fVar102;
  auVar214._8_4_ = auVar54._8_4_ * fVar207;
  auVar214._12_4_ = auVar54._12_4_ * fVar209;
  auVar44 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar3,auVar44);
  auVar49 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar159);
  local_340 = vsubps_avx512vl(_local_380,auVar6);
  uVar111 = local_340._0_4_;
  auVar55._4_4_ = uVar111;
  auVar55._0_4_ = uVar111;
  auVar55._8_4_ = uVar111;
  auVar55._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_340,local_340,0x55);
  auVar54 = vshufps_avx(local_340,local_340,0xaa);
  auVar147._0_4_ = auVar54._0_4_ * fVar211;
  auVar147._4_4_ = auVar54._4_4_ * fVar102;
  auVar147._8_4_ = auVar54._8_4_ * fVar207;
  auVar147._12_4_ = auVar54._12_4_ * fVar209;
  auVar44 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar3,auVar44);
  auVar6 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar55);
  auVar4 = vmovlhps_avx(auVar50,auVar45);
  auVar51 = vmovlhps_avx512f(auVar46,auVar47);
  auVar5 = vmovlhps_avx512f(auVar112,auVar49);
  _local_2b0 = vmovlhps_avx512f(auVar48,auVar6);
  auVar44 = vminps_avx512vl(auVar4,auVar51);
  auVar53 = vmaxps_avx512vl(auVar4,auVar51);
  auVar54 = vminps_avx512vl(auVar5,_local_2b0);
  auVar54 = vminps_avx(auVar44,auVar54);
  auVar44 = vmaxps_avx512vl(auVar5,_local_2b0);
  auVar44 = vmaxps_avx(auVar53,auVar44);
  auVar53 = vshufpd_avx(auVar54,auVar54,3);
  auVar52 = vshufpd_avx(auVar44,auVar44,3);
  auVar54 = vminps_avx(auVar54,auVar53);
  auVar44 = vmaxps_avx(auVar44,auVar52);
  auVar54 = vandps_avx512vl(auVar54,auVar239._0_16_);
  auVar44 = vandps_avx512vl(auVar44,auVar239._0_16_);
  auVar44 = vmaxps_avx(auVar54,auVar44);
  auVar54 = vmovshdup_avx(auVar44);
  auVar44 = vmaxss_avx(auVar54,auVar44);
  auVar160._8_8_ = auVar50._0_8_;
  auVar160._0_8_ = auVar50._0_8_;
  auVar54 = vmovddup_avx512vl(auVar46);
  auVar53 = vmovddup_avx512vl(auVar112);
  auVar179._0_8_ = auVar48._0_8_;
  auVar179._8_8_ = auVar179._0_8_;
  local_2c0 = ZEXT416((uint)(auVar44._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2c0);
  auVar44 = vxorps_avx512vl(local_260._0_16_,auVar240._0_16_);
  local_280 = vbroadcastss_avx512vl(auVar44);
  local_1e0 = vpbroadcastd_avx512vl();
  bVar39 = false;
  uVar31 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x60);
  auVar52 = vsubps_avx512vl(auVar51,auVar4);
  local_290 = vsubps_avx512vl(auVar5,auVar51);
  local_2a0 = vsubps_avx512vl(_local_2b0,auVar5);
  local_3d0 = vsubps_avx(_local_360,local_350);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  local_3f0 = vsubps_avx512vl(_local_3c0,local_3a0);
  _local_400 = vsubps_avx512vl(_local_380,local_370);
  local_200 = vpbroadcastd_avx512vl();
  auVar44 = ZEXT816(0x3f80000000000000);
  auVar46 = auVar44;
LAB_019fdc98:
  auVar50 = vshufps_avx(auVar46,auVar46,0x50);
  auVar228._8_4_ = 0x3f800000;
  auVar228._0_8_ = 0x3f8000003f800000;
  auVar228._12_4_ = 0x3f800000;
  auVar231._16_4_ = 0x3f800000;
  auVar231._0_16_ = auVar228;
  auVar231._20_4_ = 0x3f800000;
  auVar231._24_4_ = 0x3f800000;
  auVar231._28_4_ = 0x3f800000;
  auVar112 = vsubps_avx(auVar228,auVar50);
  fVar211 = auVar50._0_4_;
  fVar107 = auVar45._0_4_;
  auVar128._0_4_ = fVar107 * fVar211;
  fVar102 = auVar50._4_4_;
  fVar108 = auVar45._4_4_;
  auVar128._4_4_ = fVar108 * fVar102;
  fVar207 = auVar50._8_4_;
  auVar128._8_4_ = fVar107 * fVar207;
  fVar209 = auVar50._12_4_;
  auVar128._12_4_ = fVar108 * fVar209;
  fVar109 = auVar47._0_4_;
  auVar138._0_4_ = fVar109 * fVar211;
  fVar110 = auVar47._4_4_;
  auVar138._4_4_ = fVar110 * fVar102;
  auVar138._8_4_ = fVar109 * fVar207;
  auVar138._12_4_ = fVar110 * fVar209;
  fVar121 = auVar49._0_4_;
  auVar148._0_4_ = fVar121 * fVar211;
  fVar134 = auVar49._4_4_;
  auVar148._4_4_ = fVar134 * fVar102;
  auVar148._8_4_ = fVar121 * fVar207;
  auVar148._12_4_ = fVar134 * fVar209;
  fVar135 = auVar6._0_4_;
  auVar114._0_4_ = fVar135 * fVar211;
  fVar136 = auVar6._4_4_;
  auVar114._4_4_ = fVar136 * fVar102;
  auVar114._8_4_ = fVar135 * fVar207;
  auVar114._12_4_ = fVar136 * fVar209;
  auVar48 = vfmadd231ps_fma(auVar128,auVar112,auVar160);
  auVar55 = vfmadd231ps_avx512vl(auVar138,auVar112,auVar54);
  auVar56 = vfmadd231ps_avx512vl(auVar148,auVar112,auVar53);
  auVar112 = vfmadd231ps_fma(auVar114,auVar179,auVar112);
  auVar50 = vmovshdup_avx(auVar44);
  fVar102 = auVar44._0_4_;
  fVar211 = (auVar50._0_4_ - fVar102) * 0.04761905;
  auVar174._4_4_ = fVar102;
  auVar174._0_4_ = fVar102;
  auVar174._8_4_ = fVar102;
  auVar174._12_4_ = fVar102;
  auVar174._16_4_ = fVar102;
  auVar174._20_4_ = fVar102;
  auVar174._24_4_ = fVar102;
  auVar174._28_4_ = fVar102;
  auVar126._0_8_ = auVar50._0_8_;
  auVar126._8_8_ = auVar126._0_8_;
  auVar126._16_8_ = auVar126._0_8_;
  auVar126._24_8_ = auVar126._0_8_;
  auVar75 = vsubps_avx(auVar126,auVar174);
  uVar111 = auVar48._0_4_;
  auVar127._4_4_ = uVar111;
  auVar127._0_4_ = uVar111;
  auVar127._8_4_ = uVar111;
  auVar127._12_4_ = uVar111;
  auVar127._16_4_ = uVar111;
  auVar127._20_4_ = uVar111;
  auVar127._24_4_ = uVar111;
  auVar127._28_4_ = uVar111;
  auVar193._8_4_ = 1;
  auVar193._0_8_ = 0x100000001;
  auVar193._12_4_ = 1;
  auVar193._16_4_ = 1;
  auVar193._20_4_ = 1;
  auVar193._24_4_ = 1;
  auVar193._28_4_ = 1;
  auVar85 = ZEXT1632(auVar48);
  auVar73 = vpermps_avx2(auVar193,auVar85);
  auVar74 = vbroadcastss_avx512vl(auVar55);
  auVar86 = ZEXT1632(auVar55);
  auVar76 = vpermps_avx512vl(auVar193,auVar86);
  auVar77 = vbroadcastss_avx512vl(auVar56);
  auVar70 = ZEXT1632(auVar56);
  auVar78 = vpermps_avx512vl(auVar193,auVar70);
  auVar79 = vbroadcastss_avx512vl(auVar112);
  auVar82 = ZEXT1632(auVar112);
  auVar80 = vpermps_avx512vl(auVar193,auVar82);
  auVar194._4_4_ = fVar211;
  auVar194._0_4_ = fVar211;
  auVar194._8_4_ = fVar211;
  auVar194._12_4_ = fVar211;
  auVar194._16_4_ = fVar211;
  auVar194._20_4_ = fVar211;
  auVar194._24_4_ = fVar211;
  auVar194._28_4_ = fVar211;
  auVar83 = auVar245._0_32_;
  auVar71 = vpermps_avx512vl(auVar83,auVar85);
  auVar167._8_4_ = 3;
  auVar167._0_8_ = 0x300000003;
  auVar167._12_4_ = 3;
  auVar167._16_4_ = 3;
  auVar167._20_4_ = 3;
  auVar167._24_4_ = 3;
  auVar167._28_4_ = 3;
  auVar72 = vpermps_avx512vl(auVar167,auVar85);
  auVar81 = vpermps_avx512vl(auVar83,auVar86);
  auVar85 = vpermps_avx2(auVar167,auVar86);
  auVar69 = vpermps_avx512vl(auVar83,auVar70);
  auVar86 = vpermps_avx2(auVar167,auVar70);
  auVar70 = vpermps_avx512vl(auVar83,auVar82);
  auVar82 = vpermps_avx512vl(auVar167,auVar82);
  auVar50 = vfmadd132ps_fma(auVar75,auVar174,_DAT_01f7b040);
  auVar75 = vsubps_avx(auVar231,ZEXT1632(auVar50));
  auVar83 = vmulps_avx512vl(auVar74,ZEXT1632(auVar50));
  auVar87 = ZEXT1632(auVar50);
  auVar84 = vmulps_avx512vl(auVar76,auVar87);
  auVar112 = vfmadd231ps_fma(auVar83,auVar75,auVar127);
  auVar48 = vfmadd231ps_fma(auVar84,auVar75,auVar73);
  auVar83 = vmulps_avx512vl(auVar77,auVar87);
  auVar84 = vmulps_avx512vl(auVar78,auVar87);
  auVar74 = vfmadd231ps_avx512vl(auVar83,auVar75,auVar74);
  auVar76 = vfmadd231ps_avx512vl(auVar84,auVar75,auVar76);
  auVar83 = vmulps_avx512vl(auVar79,auVar87);
  auVar84 = ZEXT1632(auVar50);
  auVar80 = vmulps_avx512vl(auVar80,auVar84);
  auVar77 = vfmadd231ps_avx512vl(auVar83,auVar75,auVar77);
  auVar78 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar78);
  fVar207 = auVar50._0_4_;
  fVar209 = auVar50._4_4_;
  auVar23._4_4_ = fVar209 * auVar74._4_4_;
  auVar23._0_4_ = fVar207 * auVar74._0_4_;
  fVar196 = auVar50._8_4_;
  auVar23._8_4_ = fVar196 * auVar74._8_4_;
  fVar206 = auVar50._12_4_;
  auVar23._12_4_ = fVar206 * auVar74._12_4_;
  auVar23._16_4_ = auVar74._16_4_ * 0.0;
  auVar23._20_4_ = auVar74._20_4_ * 0.0;
  auVar23._24_4_ = auVar74._24_4_ * 0.0;
  auVar23._28_4_ = fVar102;
  auVar24._4_4_ = fVar209 * auVar76._4_4_;
  auVar24._0_4_ = fVar207 * auVar76._0_4_;
  auVar24._8_4_ = fVar196 * auVar76._8_4_;
  auVar24._12_4_ = fVar206 * auVar76._12_4_;
  auVar24._16_4_ = auVar76._16_4_ * 0.0;
  auVar24._20_4_ = auVar76._20_4_ * 0.0;
  auVar24._24_4_ = auVar76._24_4_ * 0.0;
  auVar24._28_4_ = auVar73._28_4_;
  auVar112 = vfmadd231ps_fma(auVar23,auVar75,ZEXT1632(auVar112));
  auVar48 = vfmadd231ps_fma(auVar24,auVar75,ZEXT1632(auVar48));
  auVar119._0_4_ = fVar207 * auVar77._0_4_;
  auVar119._4_4_ = fVar209 * auVar77._4_4_;
  auVar119._8_4_ = fVar196 * auVar77._8_4_;
  auVar119._12_4_ = fVar206 * auVar77._12_4_;
  auVar119._16_4_ = auVar77._16_4_ * 0.0;
  auVar119._20_4_ = auVar77._20_4_ * 0.0;
  auVar119._24_4_ = auVar77._24_4_ * 0.0;
  auVar119._28_4_ = 0;
  auVar25._4_4_ = fVar209 * auVar78._4_4_;
  auVar25._0_4_ = fVar207 * auVar78._0_4_;
  auVar25._8_4_ = fVar196 * auVar78._8_4_;
  auVar25._12_4_ = fVar206 * auVar78._12_4_;
  auVar25._16_4_ = auVar78._16_4_ * 0.0;
  auVar25._20_4_ = auVar78._20_4_ * 0.0;
  auVar25._24_4_ = auVar78._24_4_ * 0.0;
  auVar25._28_4_ = auVar77._28_4_;
  auVar55 = vfmadd231ps_fma(auVar119,auVar75,auVar74);
  auVar56 = vfmadd231ps_fma(auVar25,auVar75,auVar76);
  auVar26._28_4_ = auVar76._28_4_;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(fVar206 * auVar56._12_4_,
                          CONCAT48(fVar196 * auVar56._8_4_,
                                   CONCAT44(fVar209 * auVar56._4_4_,fVar207 * auVar56._0_4_))));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar206 * auVar55._12_4_,
                                               CONCAT48(fVar196 * auVar55._8_4_,
                                                        CONCAT44(fVar209 * auVar55._4_4_,
                                                                 fVar207 * auVar55._0_4_)))),auVar75
                            ,ZEXT1632(auVar112));
  auVar68 = vfmadd231ps_fma(auVar26,auVar75,ZEXT1632(auVar48));
  auVar73 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar112));
  auVar74 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar48));
  auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar73 = vmulps_avx512vl(auVar73,auVar76);
  auVar74 = vmulps_avx512vl(auVar74,auVar76);
  auVar188._0_4_ = fVar211 * auVar73._0_4_;
  auVar188._4_4_ = fVar211 * auVar73._4_4_;
  auVar188._8_4_ = fVar211 * auVar73._8_4_;
  auVar188._12_4_ = fVar211 * auVar73._12_4_;
  auVar188._16_4_ = fVar211 * auVar73._16_4_;
  auVar188._20_4_ = fVar211 * auVar73._20_4_;
  auVar188._24_4_ = fVar211 * auVar73._24_4_;
  auVar188._28_4_ = 0;
  auVar73 = vmulps_avx512vl(auVar194,auVar74);
  auVar48 = vxorps_avx512vl(auVar79._0_16_,auVar79._0_16_);
  auVar74 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar68),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar120._0_4_ = auVar188._0_4_ + auVar65._0_4_;
  auVar120._4_4_ = auVar188._4_4_ + auVar65._4_4_;
  auVar120._8_4_ = auVar188._8_4_ + auVar65._8_4_;
  auVar120._12_4_ = auVar188._12_4_ + auVar65._12_4_;
  auVar120._16_4_ = auVar188._16_4_ + 0.0;
  auVar120._20_4_ = auVar188._20_4_ + 0.0;
  auVar120._24_4_ = auVar188._24_4_ + 0.0;
  auVar120._28_4_ = 0;
  auVar87 = ZEXT1632(auVar48);
  auVar78 = vpermt2ps_avx512vl(auVar188,_DAT_01fb9fc0,auVar87);
  auVar79 = vaddps_avx512vl(ZEXT1632(auVar68),auVar73);
  auVar80 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,auVar87);
  auVar73 = vsubps_avx(auVar74,auVar78);
  auVar78 = vsubps_avx512vl(auVar77,auVar80);
  auVar80 = vmulps_avx512vl(auVar81,auVar84);
  auVar83 = vmulps_avx512vl(auVar85,auVar84);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar71);
  auVar71 = vfmadd231ps_avx512vl(auVar83,auVar75,auVar72);
  auVar72 = vmulps_avx512vl(auVar69,auVar84);
  auVar83 = vmulps_avx512vl(auVar86,auVar84);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar75,auVar81);
  auVar85 = vfmadd231ps_avx512vl(auVar83,auVar75,auVar85);
  auVar81 = vmulps_avx512vl(auVar70,auVar84);
  auVar70 = vmulps_avx512vl(auVar82,auVar84);
  auVar112 = vfmadd231ps_fma(auVar81,auVar75,auVar69);
  auVar81 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar86);
  auVar69 = vmulps_avx512vl(auVar84,auVar72);
  auVar82 = ZEXT1632(auVar50);
  auVar70 = vmulps_avx512vl(auVar82,auVar85);
  auVar80 = vfmadd231ps_avx512vl(auVar69,auVar75,auVar80);
  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar71);
  auVar81 = vmulps_avx512vl(auVar82,auVar81);
  auVar72 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar206 * auVar112._12_4_,
                                          CONCAT48(fVar196 * auVar112._8_4_,
                                                   CONCAT44(fVar209 * auVar112._4_4_,
                                                            fVar207 * auVar112._0_4_)))),auVar75,
                       auVar72);
  auVar85 = vfmadd231ps_avx512vl(auVar81,auVar75,auVar85);
  auVar27._4_4_ = fVar209 * auVar72._4_4_;
  auVar27._0_4_ = fVar207 * auVar72._0_4_;
  auVar27._8_4_ = fVar196 * auVar72._8_4_;
  auVar27._12_4_ = fVar206 * auVar72._12_4_;
  auVar27._16_4_ = auVar72._16_4_ * 0.0;
  auVar27._20_4_ = auVar72._20_4_ * 0.0;
  auVar27._24_4_ = auVar72._24_4_ * 0.0;
  auVar27._28_4_ = auVar86._28_4_;
  auVar86 = vmulps_avx512vl(auVar82,auVar85);
  auVar81 = vfmadd231ps_avx512vl(auVar27,auVar75,auVar80);
  auVar86 = vfmadd231ps_avx512vl(auVar86,auVar71,auVar75);
  auVar75 = vsubps_avx512vl(auVar72,auVar80);
  auVar85 = vsubps_avx512vl(auVar85,auVar71);
  auVar75 = vmulps_avx512vl(auVar75,auVar76);
  auVar85 = vmulps_avx512vl(auVar85,auVar76);
  fVar102 = fVar211 * auVar75._0_4_;
  fVar207 = fVar211 * auVar75._4_4_;
  auVar28._4_4_ = fVar207;
  auVar28._0_4_ = fVar102;
  fVar209 = fVar211 * auVar75._8_4_;
  auVar28._8_4_ = fVar209;
  fVar196 = fVar211 * auVar75._12_4_;
  auVar28._12_4_ = fVar196;
  fVar206 = fVar211 * auVar75._16_4_;
  auVar28._16_4_ = fVar206;
  fVar208 = fVar211 * auVar75._20_4_;
  auVar28._20_4_ = fVar208;
  fVar211 = fVar211 * auVar75._24_4_;
  auVar28._24_4_ = fVar211;
  auVar28._28_4_ = auVar75._28_4_;
  auVar85 = vmulps_avx512vl(auVar194,auVar85);
  auVar76 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,auVar87);
  auVar80 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar87);
  auVar195._0_4_ = auVar81._0_4_ + fVar102;
  auVar195._4_4_ = auVar81._4_4_ + fVar207;
  auVar195._8_4_ = auVar81._8_4_ + fVar209;
  auVar195._12_4_ = auVar81._12_4_ + fVar196;
  auVar195._16_4_ = auVar81._16_4_ + fVar206;
  auVar195._20_4_ = auVar81._20_4_ + fVar208;
  auVar195._24_4_ = auVar81._24_4_ + fVar211;
  auVar195._28_4_ = auVar81._28_4_ + auVar75._28_4_;
  auVar75 = vpermt2ps_avx512vl(auVar28,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar71 = vaddps_avx512vl(auVar86,auVar85);
  auVar85 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar75 = vsubps_avx(auVar76,auVar75);
  auVar85 = vsubps_avx512vl(auVar80,auVar85);
  auVar131 = ZEXT1632(auVar65);
  auVar72 = vsubps_avx512vl(auVar81,auVar131);
  auVar144 = ZEXT1632(auVar68);
  auVar69 = vsubps_avx512vl(auVar86,auVar144);
  auVar70 = vsubps_avx512vl(auVar76,auVar74);
  auVar72 = vaddps_avx512vl(auVar72,auVar70);
  auVar70 = vsubps_avx512vl(auVar80,auVar77);
  auVar69 = vaddps_avx512vl(auVar69,auVar70);
  auVar70 = vmulps_avx512vl(auVar144,auVar72);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar131,auVar69);
  auVar82 = vmulps_avx512vl(auVar79,auVar72);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar120,auVar69);
  auVar83 = vmulps_avx512vl(auVar78,auVar72);
  auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar73,auVar69);
  auVar84 = vmulps_avx512vl(auVar77,auVar72);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar74,auVar69);
  auVar87 = vmulps_avx512vl(auVar86,auVar72);
  auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar81,auVar69);
  auVar88 = vmulps_avx512vl(auVar71,auVar72);
  auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar195,auVar69);
  auVar89 = vmulps_avx512vl(auVar85,auVar72);
  auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar75,auVar69);
  auVar72 = vmulps_avx512vl(auVar80,auVar72);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar76,auVar69);
  auVar69 = vminps_avx512vl(auVar70,auVar82);
  auVar70 = vmaxps_avx512vl(auVar70,auVar82);
  auVar82 = vminps_avx512vl(auVar83,auVar84);
  auVar69 = vminps_avx512vl(auVar69,auVar82);
  auVar82 = vmaxps_avx512vl(auVar83,auVar84);
  auVar70 = vmaxps_avx512vl(auVar70,auVar82);
  auVar82 = vminps_avx512vl(auVar87,auVar88);
  auVar83 = vmaxps_avx512vl(auVar87,auVar88);
  auVar84 = vminps_avx512vl(auVar89,auVar72);
  auVar82 = vminps_avx512vl(auVar82,auVar84);
  auVar69 = vminps_avx512vl(auVar69,auVar82);
  auVar72 = vmaxps_avx512vl(auVar89,auVar72);
  auVar72 = vmaxps_avx512vl(auVar83,auVar72);
  auVar72 = vmaxps_avx512vl(auVar70,auVar72);
  uVar17 = vcmpps_avx512vl(auVar69,local_260,2);
  uVar18 = vcmpps_avx512vl(auVar72,local_280,5);
  bVar29 = (byte)uVar17 & (byte)uVar18 & 0x7f;
  if (bVar29 != 0) {
    auVar72 = vsubps_avx512vl(auVar74,auVar131);
    auVar69 = vsubps_avx512vl(auVar77,auVar144);
    auVar70 = vsubps_avx512vl(auVar76,auVar81);
    auVar72 = vaddps_avx512vl(auVar72,auVar70);
    auVar70 = vsubps_avx512vl(auVar80,auVar86);
    auVar69 = vaddps_avx512vl(auVar69,auVar70);
    auVar70 = vmulps_avx512vl(auVar144,auVar72);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar69,auVar131);
    auVar79 = vmulps_avx512vl(auVar79,auVar72);
    auVar79 = vfnmadd213ps_avx512vl(auVar120,auVar69,auVar79);
    auVar78 = vmulps_avx512vl(auVar78,auVar72);
    auVar78 = vfnmadd213ps_avx512vl(auVar73,auVar69,auVar78);
    auVar73 = vmulps_avx512vl(auVar77,auVar72);
    auVar77 = vfnmadd231ps_avx512vl(auVar73,auVar69,auVar74);
    auVar73 = vmulps_avx512vl(auVar86,auVar72);
    auVar86 = vfnmadd231ps_avx512vl(auVar73,auVar69,auVar81);
    auVar73 = vmulps_avx512vl(auVar71,auVar72);
    auVar71 = vfnmadd213ps_avx512vl(auVar195,auVar69,auVar73);
    auVar73 = vmulps_avx512vl(auVar85,auVar72);
    auVar81 = vfnmadd213ps_avx512vl(auVar75,auVar69,auVar73);
    auVar75 = vmulps_avx512vl(auVar80,auVar72);
    auVar76 = vfnmadd231ps_avx512vl(auVar75,auVar76,auVar69);
    auVar73 = vminps_avx(auVar70,auVar79);
    auVar75 = vmaxps_avx(auVar70,auVar79);
    auVar74 = vminps_avx(auVar78,auVar77);
    auVar74 = vminps_avx(auVar73,auVar74);
    auVar73 = vmaxps_avx(auVar78,auVar77);
    auVar75 = vmaxps_avx(auVar75,auVar73);
    auVar85 = vminps_avx(auVar86,auVar71);
    auVar73 = vmaxps_avx(auVar86,auVar71);
    auVar86 = vminps_avx(auVar81,auVar76);
    auVar85 = vminps_avx(auVar85,auVar86);
    auVar85 = vminps_avx(auVar74,auVar85);
    auVar74 = vmaxps_avx(auVar81,auVar76);
    auVar73 = vmaxps_avx(auVar73,auVar74);
    auVar75 = vmaxps_avx(auVar75,auVar73);
    uVar17 = vcmpps_avx512vl(auVar75,local_280,5);
    uVar18 = vcmpps_avx512vl(auVar85,local_260,2);
    bVar29 = bVar29 & (byte)uVar17 & (byte)uVar18;
    if (bVar29 != 0) {
      auStack_460[uVar31] = (uint)bVar29;
      uVar17 = vmovlps_avx(auVar44);
      (&uStack_240)[uVar31] = uVar17;
      uVar36 = vmovlps_avx(auVar46);
      auStack_1a0[uVar31] = uVar36;
      uVar31 = (ulong)((int)uVar31 + 1);
    }
  }
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar238 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar240 = ZEXT1664(auVar44);
  auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar241 = ZEXT3264(auVar75);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar242 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar243 = ZEXT1664(auVar44);
  auVar244 = ZEXT3264(_DAT_01fb9fe0);
LAB_019fe192:
  do {
    do {
      do {
        if ((int)uVar31 == 0) {
          if (bVar39) goto LAB_019ff0e6;
          uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar22._4_4_ = uVar111;
          auVar22._0_4_ = uVar111;
          auVar22._8_4_ = uVar111;
          auVar22._12_4_ = uVar111;
          auVar22._16_4_ = uVar111;
          auVar22._20_4_ = uVar111;
          auVar22._24_4_ = uVar111;
          auVar22._28_4_ = uVar111;
          uVar17 = vcmpps_avx512vl(local_1c0,auVar22,2);
          uVar37 = (ulong)((uint)uVar38 & (uint)uVar17);
          goto LAB_019fd524;
        }
        uVar30 = (int)uVar31 - 1;
        uVar32 = (ulong)uVar30;
        uVar8 = auStack_460[uVar32];
        auVar46._8_8_ = 0;
        auVar46._0_8_ = auStack_1a0[uVar32];
        uVar36 = 0;
        for (uVar35 = (ulong)uVar8; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          uVar36 = uVar36 + 1;
        }
        uVar34 = uVar8 - 1 & uVar8;
        bVar42 = uVar34 == 0;
        auStack_460[uVar32] = uVar34;
        if (bVar42) {
          uVar31 = (ulong)uVar30;
        }
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar36;
        auVar44 = vpunpcklqdq_avx(auVar103,ZEXT416((int)uVar36 + 1));
        auVar44 = vcvtqq2ps_avx512vl(auVar44);
        auVar44 = vmulps_avx512vl(auVar44,auVar242._0_16_);
        uVar111 = *(undefined4 *)((long)&uStack_240 + uVar32 * 8 + 4);
        auVar19._4_4_ = uVar111;
        auVar19._0_4_ = uVar111;
        auVar19._8_4_ = uVar111;
        auVar19._12_4_ = uVar111;
        auVar50 = vmulps_avx512vl(auVar44,auVar19);
        auVar112 = auVar243._0_16_;
        auVar44 = vsubps_avx512vl(auVar112,auVar44);
        uVar111 = *(undefined4 *)(&uStack_240 + uVar32);
        auVar20._4_4_ = uVar111;
        auVar20._0_4_ = uVar111;
        auVar20._8_4_ = uVar111;
        auVar20._12_4_ = uVar111;
        auVar44 = vfmadd231ps_avx512vl(auVar50,auVar44,auVar20);
        auVar50 = vmovshdup_avx(auVar44);
        fVar211 = auVar50._0_4_ - auVar44._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar211));
        if (uVar8 == 0 || bVar42) goto LAB_019fdc98;
        auVar50 = vshufps_avx(auVar46,auVar46,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar211));
        auVar56 = vsubps_avx512vl(auVar112,auVar50);
        fVar102 = auVar50._0_4_;
        auVar139._0_4_ = fVar102 * fVar107;
        fVar207 = auVar50._4_4_;
        auVar139._4_4_ = fVar207 * fVar108;
        fVar209 = auVar50._8_4_;
        auVar139._8_4_ = fVar209 * fVar107;
        fVar196 = auVar50._12_4_;
        auVar139._12_4_ = fVar196 * fVar108;
        auVar149._0_4_ = fVar102 * fVar109;
        auVar149._4_4_ = fVar207 * fVar110;
        auVar149._8_4_ = fVar209 * fVar109;
        auVar149._12_4_ = fVar196 * fVar110;
        auVar161._0_4_ = fVar102 * fVar121;
        auVar161._4_4_ = fVar207 * fVar134;
        auVar161._8_4_ = fVar209 * fVar121;
        auVar161._12_4_ = fVar196 * fVar134;
        auVar122._0_4_ = fVar102 * fVar135;
        auVar122._4_4_ = fVar207 * fVar136;
        auVar122._8_4_ = fVar209 * fVar135;
        auVar122._12_4_ = fVar196 * fVar136;
        auVar50 = vfmadd231ps_fma(auVar139,auVar56,auVar160);
        auVar48 = vfmadd231ps_fma(auVar149,auVar56,auVar54);
        auVar55 = vfmadd231ps_fma(auVar161,auVar56,auVar53);
        auVar56 = vfmadd231ps_fma(auVar122,auVar56,auVar179);
        auVar132._16_16_ = auVar50;
        auVar132._0_16_ = auVar50;
        auVar145._16_16_ = auVar48;
        auVar145._0_16_ = auVar48;
        auVar153._16_16_ = auVar55;
        auVar153._0_16_ = auVar55;
        auVar73 = vpermps_avx512vl(auVar244._0_32_,ZEXT1632(auVar44));
        auVar75 = vsubps_avx(auVar145,auVar132);
        auVar48 = vfmadd213ps_fma(auVar75,auVar73,auVar132);
        auVar75 = vsubps_avx(auVar153,auVar145);
        auVar65 = vfmadd213ps_fma(auVar75,auVar73,auVar145);
        auVar50 = vsubps_avx(auVar56,auVar55);
        auVar146._16_16_ = auVar50;
        auVar146._0_16_ = auVar50;
        auVar50 = vfmadd213ps_fma(auVar146,auVar73,auVar153);
        auVar75 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar48));
        auVar48 = vfmadd213ps_fma(auVar75,auVar73,ZEXT1632(auVar48));
        auVar75 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar65));
        auVar50 = vfmadd213ps_fma(auVar75,auVar73,ZEXT1632(auVar65));
        auVar75 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar48));
        auVar137 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar75,auVar73);
        auVar75 = vmulps_avx512vl(auVar75,auVar241._0_32_);
        auVar91._16_16_ = auVar75._16_16_;
        fVar102 = fVar211 * 0.33333334;
        auVar162._0_8_ =
             CONCAT44(auVar137._4_4_ + fVar102 * auVar75._4_4_,
                      auVar137._0_4_ + fVar102 * auVar75._0_4_);
        auVar162._8_4_ = auVar137._8_4_ + fVar102 * auVar75._8_4_;
        auVar162._12_4_ = auVar137._12_4_ + fVar102 * auVar75._12_4_;
        auVar140._0_4_ = fVar102 * auVar75._16_4_;
        auVar140._4_4_ = fVar102 * auVar75._20_4_;
        auVar140._8_4_ = fVar102 * auVar75._24_4_;
        auVar140._12_4_ = fVar102 * auVar75._28_4_;
        auVar63 = vsubps_avx((undefined1  [16])0x0,auVar140);
        auVar65 = vshufpd_avx(auVar137,auVar137,3);
        auVar68 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar50 = vsubps_avx(auVar65,auVar137);
        auVar48 = vsubps_avx(auVar68,(undefined1  [16])0x0);
        auVar180._0_4_ = auVar50._0_4_ + auVar48._0_4_;
        auVar180._4_4_ = auVar50._4_4_ + auVar48._4_4_;
        auVar180._8_4_ = auVar50._8_4_ + auVar48._8_4_;
        auVar180._12_4_ = auVar50._12_4_ + auVar48._12_4_;
        auVar50 = vshufps_avx(auVar137,auVar137,0xb1);
        auVar48 = vshufps_avx(auVar162,auVar162,0xb1);
        auVar55 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar56 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar229._4_4_ = auVar180._0_4_;
        auVar229._0_4_ = auVar180._0_4_;
        auVar229._8_4_ = auVar180._0_4_;
        auVar229._12_4_ = auVar180._0_4_;
        auVar59 = vshufps_avx(auVar180,auVar180,0x55);
        fVar102 = auVar59._0_4_;
        auVar191._0_4_ = auVar50._0_4_ * fVar102;
        fVar207 = auVar59._4_4_;
        auVar191._4_4_ = auVar50._4_4_ * fVar207;
        fVar209 = auVar59._8_4_;
        auVar191._8_4_ = auVar50._8_4_ * fVar209;
        fVar196 = auVar59._12_4_;
        auVar191._12_4_ = auVar50._12_4_ * fVar196;
        auVar198._0_4_ = auVar48._0_4_ * fVar102;
        auVar198._4_4_ = auVar48._4_4_ * fVar207;
        auVar198._8_4_ = auVar48._8_4_ * fVar209;
        auVar198._12_4_ = auVar48._12_4_ * fVar196;
        auVar215._0_4_ = auVar55._0_4_ * fVar102;
        auVar215._4_4_ = auVar55._4_4_ * fVar207;
        auVar215._8_4_ = auVar55._8_4_ * fVar209;
        auVar215._12_4_ = auVar55._12_4_ * fVar196;
        auVar181._0_4_ = auVar56._0_4_ * fVar102;
        auVar181._4_4_ = auVar56._4_4_ * fVar207;
        auVar181._8_4_ = auVar56._8_4_ * fVar209;
        auVar181._12_4_ = auVar56._12_4_ * fVar196;
        auVar50 = vfmadd231ps_fma(auVar191,auVar229,auVar137);
        auVar48 = vfmadd231ps_fma(auVar198,auVar229,auVar162);
        auVar61 = vfmadd231ps_fma(auVar215,auVar229,auVar63);
        auVar62 = vfmadd231ps_fma(auVar181,(undefined1  [16])0x0,auVar229);
        auVar59 = vshufpd_avx(auVar50,auVar50,1);
        auVar60 = vshufpd_avx(auVar48,auVar48,1);
        auVar57 = vshufpd_avx512vl(auVar61,auVar61,1);
        auVar58 = vshufpd_avx512vl(auVar62,auVar62,1);
        auVar55 = vminss_avx(auVar50,auVar48);
        auVar50 = vmaxss_avx(auVar48,auVar50);
        auVar56 = vminss_avx(auVar61,auVar62);
        auVar48 = vmaxss_avx(auVar62,auVar61);
        auVar55 = vminss_avx(auVar55,auVar56);
        auVar50 = vmaxss_avx(auVar48,auVar50);
        auVar56 = vminss_avx(auVar59,auVar60);
        auVar48 = vmaxss_avx(auVar60,auVar59);
        auVar59 = vminss_avx512f(auVar57,auVar58);
        auVar60 = vmaxss_avx512f(auVar58,auVar57);
        auVar48 = vmaxss_avx(auVar60,auVar48);
        auVar56 = vminss_avx512f(auVar56,auVar59);
        fVar207 = auVar48._0_4_;
        fVar102 = auVar50._0_4_;
        if (auVar55._0_4_ < 0.0001) {
          bVar43 = fVar207 == -0.0001;
          bVar40 = NAN(fVar207);
          if (fVar207 <= -0.0001) goto LAB_019fe3bc;
          break;
        }
LAB_019fe3bc:
        vucomiss_avx512f(auVar56);
        bVar43 = fVar207 <= -0.0001;
        bVar41 = -0.0001 < fVar102;
        bVar40 = bVar43;
        if (!bVar43) break;
        uVar17 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar18 = vcmpps_avx512vl(auVar56,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar29 = (byte)uVar17 & (byte)uVar18;
        bVar13 = (bVar29 & 1) == 0;
        bVar43 = bVar41 && bVar13;
        bVar40 = bVar41 && (bVar29 & 1) == 0;
      } while (!bVar41 || !bVar13);
      auVar61 = auVar246._0_16_;
      vcmpss_avx512f(auVar55,auVar61,1);
      uVar17 = vcmpss_avx512f(auVar50,auVar61,1);
      bVar41 = (bool)((byte)uVar17 & 1);
      auVar91._0_16_ = auVar247._0_16_;
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * auVar247._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      bVar40 = (bool)(!bVar43 | bVar40);
      bVar41 = bVar40 == false;
      auVar93._16_16_ = auVar91._16_16_;
      auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (uint)bVar40 * auVar246._0_4_ + (uint)!bVar40 * 0x7f800000;
      auVar60 = auVar92._0_16_;
      auVar95._16_16_ = auVar91._16_16_;
      auVar95._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar40 * auVar246._0_4_ + (uint)!bVar40 * -0x800000;
      auVar59 = auVar94._0_16_;
      uVar17 = vcmpss_avx512f(auVar56,auVar61,1);
      bVar43 = (bool)((byte)uVar17 & 1);
      auVar97._16_16_ = auVar91._16_16_;
      auVar97._0_16_ = auVar247._0_16_;
      auVar96._4_28_ = auVar97._4_28_;
      auVar96._0_4_ = (float)((uint)bVar43 * -0x40800000 + (uint)!bVar43 * auVar247._0_4_);
      vucomiss_avx512f(auVar96._0_16_);
      if ((bVar40) || (bVar41)) {
        auVar56 = vucomiss_avx512f(auVar55);
        if ((bVar40) || (bVar41)) {
          auVar62 = vxorps_avx512vl(auVar55,auVar240._0_16_);
          auVar55 = vsubss_avx512f(auVar56,auVar55);
          auVar55 = vdivss_avx512f(auVar62,auVar55);
          auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),auVar55);
          auVar56 = vfmadd213ss_avx512f(auVar56,auVar61,auVar55);
          auVar55 = auVar56;
        }
        else {
          auVar55 = vxorps_avx512vl(auVar56,auVar56);
          vucomiss_avx512f(auVar55);
          auVar56 = ZEXT416(0x3f800000);
          if ((bVar40) || (bVar41)) {
            auVar56 = SUB6416(ZEXT464(0xff800000),0);
            auVar55 = ZEXT416(0x7f800000);
          }
        }
        auVar60 = vminss_avx512f(auVar60,auVar55);
        auVar59 = vmaxss_avx(auVar56,auVar59);
      }
      auVar247 = ZEXT464(0x3f800000);
      uVar17 = vcmpss_avx512f(auVar48,auVar61,1);
      bVar43 = (bool)((byte)uVar17 & 1);
      auVar48 = auVar247._0_16_;
      fVar209 = (float)((uint)bVar43 * -0x40800000 + (uint)!bVar43 * 0x3f800000);
      if ((auVar90._0_4_ != fVar209) || (NAN(auVar90._0_4_) || NAN(fVar209))) {
        if ((fVar207 != fVar102) || (NAN(fVar207) || NAN(fVar102))) {
          auVar50 = vxorps_avx512vl(auVar50,auVar240._0_16_);
          auVar182._0_4_ = auVar50._0_4_ / (fVar207 - fVar102);
          auVar182._4_12_ = auVar50._4_12_;
          auVar50 = vsubss_avx512f(auVar48,auVar182);
          auVar50 = vfmadd213ss_avx512f(auVar50,auVar61,auVar182);
          auVar55 = auVar50;
        }
        else if ((fVar102 != 0.0) ||
                (auVar50 = auVar48, auVar55 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar102))) {
          auVar50 = SUB6416(ZEXT464(0xff800000),0);
          auVar55 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar60 = vminss_avx(auVar60,auVar55);
        auVar59 = vmaxss_avx(auVar50,auVar59);
      }
      bVar43 = auVar96._0_4_ != fVar209;
      auVar50 = vminss_avx512f(auVar60,auVar48);
      auVar99._16_16_ = auVar91._16_16_;
      auVar99._0_16_ = auVar60;
      auVar98._4_28_ = auVar99._4_28_;
      auVar98._0_4_ = (uint)bVar43 * auVar50._0_4_ + (uint)!bVar43 * auVar60._0_4_;
      auVar50 = vmaxss_avx512f(auVar48,auVar59);
      auVar101._16_16_ = auVar91._16_16_;
      auVar101._0_16_ = auVar59;
      auVar100._4_28_ = auVar101._4_28_;
      auVar100._0_4_ = (uint)bVar43 * auVar50._0_4_ + (uint)!bVar43 * auVar59._0_4_;
      auVar50 = vmaxss_avx512f(auVar61,auVar98._0_16_);
      auVar55 = vminss_avx512f(auVar100._0_16_,auVar48);
    } while (auVar55._0_4_ < auVar50._0_4_);
    auVar61 = vmaxss_avx512f(auVar61,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
    auVar62 = vminss_avx512f(ZEXT416((uint)(auVar55._0_4_ + 0.1)),auVar48);
    auVar123._0_8_ = auVar137._0_8_;
    auVar123._8_8_ = auVar123._0_8_;
    auVar199._8_8_ = auVar162._0_8_;
    auVar199._0_8_ = auVar162._0_8_;
    auVar216._8_8_ = auVar63._0_8_;
    auVar216._0_8_ = auVar63._0_8_;
    auVar50 = vshufpd_avx(auVar162,auVar162,3);
    auVar55 = vshufpd_avx(auVar63,auVar63,3);
    auVar56 = vshufps_avx(auVar61,auVar62,0);
    auVar60 = vsubps_avx512vl(auVar112,auVar56);
    fVar102 = auVar56._0_4_;
    auVar150._0_4_ = fVar102 * auVar65._0_4_;
    fVar207 = auVar56._4_4_;
    auVar150._4_4_ = fVar207 * auVar65._4_4_;
    fVar209 = auVar56._8_4_;
    auVar150._8_4_ = fVar209 * auVar65._8_4_;
    fVar196 = auVar56._12_4_;
    auVar150._12_4_ = fVar196 * auVar65._12_4_;
    auVar163._0_4_ = fVar102 * auVar50._0_4_;
    auVar163._4_4_ = fVar207 * auVar50._4_4_;
    auVar163._8_4_ = fVar209 * auVar50._8_4_;
    auVar163._12_4_ = fVar196 * auVar50._12_4_;
    auVar232._0_4_ = auVar55._0_4_ * fVar102;
    auVar232._4_4_ = auVar55._4_4_ * fVar207;
    auVar232._8_4_ = auVar55._8_4_ * fVar209;
    auVar232._12_4_ = auVar55._12_4_ * fVar196;
    auVar141._0_4_ = fVar102 * auVar68._0_4_;
    auVar141._4_4_ = fVar207 * auVar68._4_4_;
    auVar141._8_4_ = fVar209 * auVar68._8_4_;
    auVar141._12_4_ = fVar196 * auVar68._12_4_;
    auVar65 = vfmadd231ps_fma(auVar150,auVar60,auVar123);
    auVar68 = vfmadd231ps_fma(auVar163,auVar60,auVar199);
    auVar59 = vfmadd231ps_fma(auVar232,auVar60,auVar216);
    auVar60 = vfmadd231ps_fma(auVar141,auVar60,ZEXT816(0));
    auVar55 = vsubss_avx512f(auVar48,auVar61);
    auVar50 = vmovshdup_avx(auVar46);
    auVar137 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar61._0_4_)),auVar46,auVar55);
    auVar55 = vsubss_avx512f(auVar48,auVar62);
    auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar62._0_4_)),auVar46,auVar55);
    auVar63 = vdivss_avx512f(auVar48,ZEXT416((uint)fVar211));
    auVar50 = vsubps_avx(auVar68,auVar65);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar55 = vmulps_avx512vl(auVar50,auVar61);
    auVar50 = vsubps_avx(auVar59,auVar68);
    auVar56 = vmulps_avx512vl(auVar50,auVar61);
    auVar50 = vsubps_avx(auVar60,auVar59);
    auVar50 = vmulps_avx512vl(auVar50,auVar61);
    auVar46 = vminps_avx(auVar56,auVar50);
    auVar50 = vmaxps_avx(auVar56,auVar50);
    auVar46 = vminps_avx(auVar55,auVar46);
    auVar50 = vmaxps_avx(auVar55,auVar50);
    auVar55 = vshufpd_avx(auVar46,auVar46,3);
    auVar56 = vshufpd_avx(auVar50,auVar50,3);
    auVar46 = vminps_avx(auVar46,auVar55);
    auVar50 = vmaxps_avx(auVar50,auVar56);
    fVar211 = auVar63._0_4_;
    auVar183._0_4_ = auVar46._0_4_ * fVar211;
    auVar183._4_4_ = auVar46._4_4_ * fVar211;
    auVar183._8_4_ = auVar46._8_4_ * fVar211;
    auVar183._12_4_ = auVar46._12_4_ * fVar211;
    auVar170._0_4_ = fVar211 * auVar50._0_4_;
    auVar170._4_4_ = fVar211 * auVar50._4_4_;
    auVar170._8_4_ = fVar211 * auVar50._8_4_;
    auVar170._12_4_ = fVar211 * auVar50._12_4_;
    auVar63 = vdivss_avx512f(auVar48,ZEXT416((uint)(auVar57._0_4_ - auVar137._0_4_)));
    auVar50 = vshufpd_avx(auVar65,auVar65,3);
    auVar46 = vshufpd_avx(auVar68,auVar68,3);
    auVar55 = vshufpd_avx(auVar59,auVar59,3);
    auVar56 = vshufpd_avx(auVar60,auVar60,3);
    auVar50 = vsubps_avx(auVar50,auVar65);
    auVar65 = vsubps_avx(auVar46,auVar68);
    auVar68 = vsubps_avx(auVar55,auVar59);
    auVar56 = vsubps_avx(auVar56,auVar60);
    auVar46 = vminps_avx(auVar50,auVar65);
    auVar50 = vmaxps_avx(auVar50,auVar65);
    auVar55 = vminps_avx(auVar68,auVar56);
    auVar55 = vminps_avx(auVar46,auVar55);
    auVar46 = vmaxps_avx(auVar68,auVar56);
    auVar50 = vmaxps_avx(auVar50,auVar46);
    fVar211 = auVar63._0_4_;
    auVar217._0_4_ = fVar211 * auVar55._0_4_;
    auVar217._4_4_ = fVar211 * auVar55._4_4_;
    auVar217._8_4_ = fVar211 * auVar55._8_4_;
    auVar217._12_4_ = fVar211 * auVar55._12_4_;
    auVar200._0_4_ = fVar211 * auVar50._0_4_;
    auVar200._4_4_ = fVar211 * auVar50._4_4_;
    auVar200._8_4_ = fVar211 * auVar50._8_4_;
    auVar200._12_4_ = fVar211 * auVar50._12_4_;
    auVar56 = vinsertps_avx(auVar44,auVar137,0x10);
    auVar58 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9f90,auVar57);
    auVar113._0_4_ = auVar56._0_4_ + auVar58._0_4_;
    auVar113._4_4_ = auVar56._4_4_ + auVar58._4_4_;
    auVar113._8_4_ = auVar56._8_4_ + auVar58._8_4_;
    auVar113._12_4_ = auVar56._12_4_ + auVar58._12_4_;
    auVar63 = vmulps_avx512vl(auVar113,auVar238._0_16_);
    auVar46 = vshufps_avx(auVar63,auVar63,0x54);
    uVar111 = auVar63._0_4_;
    auVar115._4_4_ = uVar111;
    auVar115._0_4_ = uVar111;
    auVar115._8_4_ = uVar111;
    auVar115._12_4_ = uVar111;
    auVar55 = vfmadd213ps_fma(auVar52,auVar115,auVar4);
    auVar65 = vfmadd213ps_fma(local_290,auVar115,auVar51);
    auVar68 = vfmadd213ps_fma(local_2a0,auVar115,auVar5);
    auVar50 = vsubps_avx(auVar65,auVar55);
    auVar55 = vfmadd213ps_fma(auVar50,auVar115,auVar55);
    auVar50 = vsubps_avx(auVar68,auVar65);
    auVar50 = vfmadd213ps_fma(auVar50,auVar115,auVar65);
    auVar50 = vsubps_avx(auVar50,auVar55);
    auVar55 = vfmadd231ps_fma(auVar55,auVar50,auVar115);
    auVar59 = vmulps_avx512vl(auVar50,auVar61);
    auVar224._8_8_ = auVar55._0_8_;
    auVar224._0_8_ = auVar55._0_8_;
    auVar50 = vshufpd_avx(auVar55,auVar55,3);
    auVar55 = vshufps_avx(auVar63,auVar63,0x55);
    auVar65 = vsubps_avx(auVar50,auVar224);
    auVar68 = vfmadd231ps_fma(auVar224,auVar55,auVar65);
    auVar233._8_8_ = auVar59._0_8_;
    auVar233._0_8_ = auVar59._0_8_;
    auVar50 = vshufpd_avx(auVar59,auVar59,3);
    auVar50 = vsubps_avx512vl(auVar50,auVar233);
    auVar50 = vfmadd213ps_avx512vl(auVar50,auVar55,auVar233);
    auVar116._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
    auVar116._8_4_ = auVar65._8_4_ ^ 0x80000000;
    auVar116._12_4_ = auVar65._12_4_ ^ 0x80000000;
    auVar55 = vmovshdup_avx512vl(auVar50);
    auVar234._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
    auVar234._8_4_ = auVar55._8_4_ ^ 0x80000000;
    auVar234._12_4_ = auVar55._12_4_ ^ 0x80000000;
    auVar59 = vmovshdup_avx512vl(auVar65);
    auVar60 = vpermt2ps_avx512vl(auVar234,ZEXT416(5),auVar65);
    auVar64 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar246 = ZEXT1664(auVar64);
    auVar55 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar65._0_4_)),auVar50,auVar59);
    auVar65 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar116);
    auVar142._0_4_ = auVar55._0_4_;
    auVar142._4_4_ = auVar142._0_4_;
    auVar142._8_4_ = auVar142._0_4_;
    auVar142._12_4_ = auVar142._0_4_;
    auVar50 = vdivps_avx(auVar60,auVar142);
    auVar66 = vdivps_avx512vl(auVar65,auVar142);
    fVar211 = auVar68._0_4_;
    auVar55 = vshufps_avx(auVar68,auVar68,0x55);
    auVar225._0_4_ = fVar211 * auVar50._0_4_ + auVar55._0_4_ * auVar66._0_4_;
    auVar225._4_4_ = fVar211 * auVar50._4_4_ + auVar55._4_4_ * auVar66._4_4_;
    auVar225._8_4_ = fVar211 * auVar50._8_4_ + auVar55._8_4_ * auVar66._8_4_;
    auVar225._12_4_ = fVar211 * auVar50._12_4_ + auVar55._12_4_ * auVar66._12_4_;
    auVar61 = vsubps_avx(auVar46,auVar225);
    auVar55 = vmovshdup_avx(auVar50);
    auVar46 = vinsertps_avx(auVar183,auVar217,0x1c);
    auVar235._0_4_ = auVar55._0_4_ * auVar46._0_4_;
    auVar235._4_4_ = auVar55._4_4_ * auVar46._4_4_;
    auVar235._8_4_ = auVar55._8_4_ * auVar46._8_4_;
    auVar235._12_4_ = auVar55._12_4_ * auVar46._12_4_;
    auVar62 = vinsertps_avx512f(auVar170,auVar200,0x1c);
    auVar55 = vmulps_avx512vl(auVar55,auVar62);
    auVar60 = vminps_avx512vl(auVar235,auVar55);
    auVar68 = vmaxps_avx(auVar55,auVar235);
    auVar59 = vmovshdup_avx(auVar66);
    auVar55 = vinsertps_avx(auVar217,auVar183,0x4c);
    auVar218._0_4_ = auVar59._0_4_ * auVar55._0_4_;
    auVar218._4_4_ = auVar59._4_4_ * auVar55._4_4_;
    auVar218._8_4_ = auVar59._8_4_ * auVar55._8_4_;
    auVar218._12_4_ = auVar59._12_4_ * auVar55._12_4_;
    auVar65 = vinsertps_avx(auVar200,auVar170,0x4c);
    auVar201._0_4_ = auVar59._0_4_ * auVar65._0_4_;
    auVar201._4_4_ = auVar59._4_4_ * auVar65._4_4_;
    auVar201._8_4_ = auVar59._8_4_ * auVar65._8_4_;
    auVar201._12_4_ = auVar59._12_4_ * auVar65._12_4_;
    auVar59 = vminps_avx(auVar218,auVar201);
    auVar60 = vaddps_avx512vl(auVar60,auVar59);
    auVar59 = vmaxps_avx(auVar201,auVar218);
    auVar202._0_4_ = auVar68._0_4_ + auVar59._0_4_;
    auVar202._4_4_ = auVar68._4_4_ + auVar59._4_4_;
    auVar202._8_4_ = auVar68._8_4_ + auVar59._8_4_;
    auVar202._12_4_ = auVar68._12_4_ + auVar59._12_4_;
    auVar219._8_8_ = 0x3f80000000000000;
    auVar219._0_8_ = 0x3f80000000000000;
    auVar68 = vsubps_avx(auVar219,auVar202);
    auVar59 = vsubps_avx(auVar219,auVar60);
    auVar60 = vsubps_avx(auVar56,auVar63);
    auVar63 = vsubps_avx(auVar58,auVar63);
    fVar196 = auVar60._0_4_;
    auVar236._0_4_ = fVar196 * auVar68._0_4_;
    fVar206 = auVar60._4_4_;
    auVar236._4_4_ = fVar206 * auVar68._4_4_;
    fVar208 = auVar60._8_4_;
    auVar236._8_4_ = fVar208 * auVar68._8_4_;
    fVar210 = auVar60._12_4_;
    auVar236._12_4_ = fVar210 * auVar68._12_4_;
    auVar67 = vbroadcastss_avx512vl(auVar50);
    auVar46 = vmulps_avx512vl(auVar67,auVar46);
    auVar62 = vmulps_avx512vl(auVar67,auVar62);
    auVar67 = vminps_avx512vl(auVar46,auVar62);
    auVar62 = vmaxps_avx512vl(auVar62,auVar46);
    auVar46 = vbroadcastss_avx512vl(auVar66);
    auVar55 = vmulps_avx512vl(auVar46,auVar55);
    auVar46 = vmulps_avx512vl(auVar46,auVar65);
    auVar65 = vminps_avx512vl(auVar55,auVar46);
    auVar65 = vaddps_avx512vl(auVar67,auVar65);
    auVar60 = vmulps_avx512vl(auVar60,auVar59);
    fVar211 = auVar63._0_4_;
    auVar203._0_4_ = fVar211 * auVar68._0_4_;
    fVar102 = auVar63._4_4_;
    auVar203._4_4_ = fVar102 * auVar68._4_4_;
    fVar207 = auVar63._8_4_;
    auVar203._8_4_ = fVar207 * auVar68._8_4_;
    fVar209 = auVar63._12_4_;
    auVar203._12_4_ = fVar209 * auVar68._12_4_;
    auVar220._0_4_ = fVar211 * auVar59._0_4_;
    auVar220._4_4_ = fVar102 * auVar59._4_4_;
    auVar220._8_4_ = fVar207 * auVar59._8_4_;
    auVar220._12_4_ = fVar209 * auVar59._12_4_;
    auVar46 = vmaxps_avx(auVar46,auVar55);
    auVar171._0_4_ = auVar62._0_4_ + auVar46._0_4_;
    auVar171._4_4_ = auVar62._4_4_ + auVar46._4_4_;
    auVar171._8_4_ = auVar62._8_4_ + auVar46._8_4_;
    auVar171._12_4_ = auVar62._12_4_ + auVar46._12_4_;
    auVar184._8_8_ = 0x3f800000;
    auVar184._0_8_ = 0x3f800000;
    auVar46 = vsubps_avx(auVar184,auVar171);
    auVar55 = vsubps_avx512vl(auVar184,auVar65);
    auVar230._0_4_ = fVar196 * auVar46._0_4_;
    auVar230._4_4_ = fVar206 * auVar46._4_4_;
    auVar230._8_4_ = fVar208 * auVar46._8_4_;
    auVar230._12_4_ = fVar210 * auVar46._12_4_;
    auVar226._0_4_ = fVar196 * auVar55._0_4_;
    auVar226._4_4_ = fVar206 * auVar55._4_4_;
    auVar226._8_4_ = fVar208 * auVar55._8_4_;
    auVar226._12_4_ = fVar210 * auVar55._12_4_;
    auVar172._0_4_ = fVar211 * auVar46._0_4_;
    auVar172._4_4_ = fVar102 * auVar46._4_4_;
    auVar172._8_4_ = fVar207 * auVar46._8_4_;
    auVar172._12_4_ = fVar209 * auVar46._12_4_;
    auVar185._0_4_ = fVar211 * auVar55._0_4_;
    auVar185._4_4_ = fVar102 * auVar55._4_4_;
    auVar185._8_4_ = fVar207 * auVar55._8_4_;
    auVar185._12_4_ = fVar209 * auVar55._12_4_;
    auVar46 = vminps_avx(auVar230,auVar226);
    auVar55 = vminps_avx512vl(auVar172,auVar185);
    auVar65 = vminps_avx512vl(auVar46,auVar55);
    auVar46 = vmaxps_avx(auVar226,auVar230);
    auVar55 = vmaxps_avx(auVar185,auVar172);
    auVar55 = vmaxps_avx(auVar55,auVar46);
    auVar68 = vminps_avx512vl(auVar236,auVar60);
    auVar46 = vminps_avx(auVar203,auVar220);
    auVar46 = vminps_avx(auVar68,auVar46);
    auVar46 = vhaddps_avx(auVar65,auVar46);
    auVar68 = vmaxps_avx512vl(auVar60,auVar236);
    auVar65 = vmaxps_avx(auVar220,auVar203);
    auVar65 = vmaxps_avx(auVar65,auVar68);
    auVar55 = vhaddps_avx(auVar55,auVar65);
    auVar46 = vshufps_avx(auVar46,auVar46,0xe8);
    auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
    auVar173._0_4_ = auVar46._0_4_ + auVar61._0_4_;
    auVar173._4_4_ = auVar46._4_4_ + auVar61._4_4_;
    auVar173._8_4_ = auVar46._8_4_ + auVar61._8_4_;
    auVar173._12_4_ = auVar46._12_4_ + auVar61._12_4_;
    auVar186._0_4_ = auVar55._0_4_ + auVar61._0_4_;
    auVar186._4_4_ = auVar55._4_4_ + auVar61._4_4_;
    auVar186._8_4_ = auVar55._8_4_ + auVar61._8_4_;
    auVar186._12_4_ = auVar55._12_4_ + auVar61._12_4_;
    auVar46 = vmaxps_avx(auVar56,auVar173);
    auVar55 = vminps_avx(auVar186,auVar58);
    uVar36 = vcmpps_avx512vl(auVar55,auVar46,1);
  } while ((uVar36 & 3) != 0);
  uVar36 = vcmpps_avx512vl(auVar186,auVar58,1);
  uVar17 = vcmpps_avx512vl(auVar44,auVar173,1);
  if (((ushort)uVar17 & (ushort)uVar36 & 1) == 0) {
    bVar29 = 0;
  }
  else {
    auVar46 = vmovshdup_avx(auVar173);
    bVar29 = auVar137._0_4_ < auVar46._0_4_ & (byte)(uVar36 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar31 || uVar8 != 0 && !bVar42) | bVar29) != 1) goto LAB_019ff06a;
  lVar33 = 0xc9;
  do {
    lVar33 = lVar33 + -1;
    if (lVar33 == 0) goto LAB_019fe192;
    auVar44 = vsubss_avx512f(auVar48,auVar61);
    fVar207 = auVar44._0_4_;
    fVar211 = fVar207 * fVar207 * fVar207;
    fVar209 = auVar61._0_4_;
    fVar102 = fVar209 * 3.0 * fVar207 * fVar207;
    fVar207 = fVar207 * fVar209 * fVar209 * 3.0;
    auVar129._4_4_ = fVar211;
    auVar129._0_4_ = fVar211;
    auVar129._8_4_ = fVar211;
    auVar129._12_4_ = fVar211;
    auVar124._4_4_ = fVar102;
    auVar124._0_4_ = fVar102;
    auVar124._8_4_ = fVar102;
    auVar124._12_4_ = fVar102;
    auVar104._4_4_ = fVar207;
    auVar104._0_4_ = fVar207;
    auVar104._8_4_ = fVar207;
    auVar104._12_4_ = fVar207;
    fVar209 = fVar209 * fVar209 * fVar209;
    auVar151._0_4_ = (float)local_2b0._0_4_ * fVar209;
    auVar151._4_4_ = (float)local_2b0._4_4_ * fVar209;
    auVar151._8_4_ = fStack_2a8 * fVar209;
    auVar151._12_4_ = fStack_2a4 * fVar209;
    auVar44 = vfmadd231ps_fma(auVar151,auVar5,auVar104);
    auVar44 = vfmadd231ps_fma(auVar44,auVar51,auVar124);
    auVar44 = vfmadd231ps_fma(auVar44,auVar4,auVar129);
    auVar105._8_8_ = auVar44._0_8_;
    auVar105._0_8_ = auVar44._0_8_;
    auVar44 = vshufpd_avx(auVar44,auVar44,3);
    auVar46 = vshufps_avx(auVar61,auVar61,0x55);
    auVar44 = vsubps_avx(auVar44,auVar105);
    auVar46 = vfmadd213ps_fma(auVar44,auVar46,auVar105);
    fVar211 = auVar46._0_4_;
    auVar44 = vshufps_avx(auVar46,auVar46,0x55);
    auVar106._0_4_ = auVar50._0_4_ * fVar211 + auVar66._0_4_ * auVar44._0_4_;
    auVar106._4_4_ = auVar50._4_4_ * fVar211 + auVar66._4_4_ * auVar44._4_4_;
    auVar106._8_4_ = auVar50._8_4_ * fVar211 + auVar66._8_4_ * auVar44._8_4_;
    auVar106._12_4_ = auVar50._12_4_ * fVar211 + auVar66._12_4_ * auVar44._12_4_;
    auVar61 = vsubps_avx(auVar61,auVar106);
    auVar44 = vandps_avx512vl(auVar46,auVar239._0_16_);
    auVar46 = vprolq_avx512vl(auVar44,0x20);
    auVar44 = vmaxss_avx(auVar46,auVar44);
    bVar42 = (float)local_2c0._0_4_ < auVar44._0_4_;
  } while ((float)local_2c0._0_4_ <= auVar44._0_4_);
  auVar44 = vucomiss_avx512f(auVar64);
  if (bVar42) goto LAB_019fe192;
  auVar50 = vucomiss_avx512f(auVar44);
  auVar247 = ZEXT1664(auVar50);
  if (bVar42) goto LAB_019fe192;
  vmovshdup_avx(auVar44);
  auVar50 = vucomiss_avx512f(auVar64);
  if (bVar42) goto LAB_019fe192;
  auVar46 = vucomiss_avx512f(auVar50);
  auVar247 = ZEXT1664(auVar46);
  if (bVar42) goto LAB_019fe192;
  auVar48 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar63 = vinsertps_avx(auVar48,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar48 = vdpps_avx(auVar63,local_2d0,0x7f);
  auVar55 = vdpps_avx(auVar63,local_2e0,0x7f);
  auVar56 = vdpps_avx(auVar63,local_2f0,0x7f);
  auVar65 = vdpps_avx(auVar63,local_300,0x7f);
  auVar68 = vdpps_avx(auVar63,local_310,0x7f);
  auVar59 = vdpps_avx(auVar63,local_320,0x7f);
  auVar60 = vdpps_avx(auVar63,local_330,0x7f);
  auVar63 = vdpps_avx(auVar63,local_340,0x7f);
  auVar61 = vsubss_avx512f(auVar46,auVar50);
  fVar211 = auVar50._0_4_;
  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar68._0_4_)),auVar61,auVar48);
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar211)),auVar61,auVar55);
  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar211)),auVar61,auVar56);
  auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar63._0_4_)),auVar61,auVar65);
  auVar46 = vsubss_avx512f(auVar46,auVar44);
  auVar152._0_4_ = auVar46._0_4_;
  fVar211 = auVar152._0_4_ * auVar152._0_4_ * auVar152._0_4_;
  local_120 = auVar44._0_4_;
  fVar102 = local_120 * 3.0 * auVar152._0_4_ * auVar152._0_4_;
  fVar207 = auVar152._0_4_ * local_120 * local_120 * 3.0;
  fVar209 = local_120 * local_120 * local_120;
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar56._0_4_)),ZEXT416((uint)fVar207),auVar55)
  ;
  auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar102),auVar48);
  vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar211),auVar50);
  auVar50 = vucomiss_avx512f(ZEXT416(uVar1));
  if (bVar42) goto LAB_019fe192;
  fVar196 = *(float *)(ray + k * 4 + 0x100);
  if (fVar196 < auVar50._0_4_) goto LAB_019fe192;
  auVar46 = vshufps_avx(auVar44,auVar44,0x55);
  auVar55 = vsubps_avx512vl(auVar112,auVar46);
  fVar206 = auVar46._0_4_;
  auVar187._0_4_ = fVar206 * (float)local_360._0_4_;
  fVar208 = auVar46._4_4_;
  auVar187._4_4_ = fVar208 * (float)local_360._4_4_;
  fVar210 = auVar46._8_4_;
  auVar187._8_4_ = fVar210 * fStack_358;
  fVar212 = auVar46._12_4_;
  auVar187._12_4_ = fVar212 * fStack_354;
  auVar192._0_4_ = fVar206 * (float)local_3b0._0_4_;
  auVar192._4_4_ = fVar208 * (float)local_3b0._4_4_;
  auVar192._8_4_ = fVar210 * fStack_3a8;
  auVar192._12_4_ = fVar212 * fStack_3a4;
  auVar204._0_4_ = fVar206 * (float)local_3c0._0_4_;
  auVar204._4_4_ = fVar208 * (float)local_3c0._4_4_;
  auVar204._8_4_ = fVar210 * fStack_3b8;
  auVar204._12_4_ = fVar212 * fStack_3b4;
  auVar164._0_4_ = fVar206 * (float)local_380._0_4_;
  auVar164._4_4_ = fVar208 * (float)local_380._4_4_;
  auVar164._8_4_ = fVar210 * fStack_378;
  auVar164._12_4_ = fVar212 * fStack_374;
  auVar46 = vfmadd231ps_fma(auVar187,auVar55,local_350);
  auVar112 = vfmadd231ps_fma(auVar192,auVar55,local_390);
  auVar48 = vfmadd231ps_fma(auVar204,auVar55,local_3a0);
  auVar55 = vfmadd231ps_fma(auVar164,auVar55,local_370);
  auVar46 = vsubps_avx(auVar112,auVar46);
  auVar112 = vsubps_avx(auVar48,auVar112);
  auVar48 = vsubps_avx(auVar55,auVar48);
  auVar205._0_4_ = local_120 * auVar112._0_4_;
  auVar205._4_4_ = local_120 * auVar112._4_4_;
  auVar205._8_4_ = local_120 * auVar112._8_4_;
  auVar205._12_4_ = local_120 * auVar112._12_4_;
  auVar152._4_4_ = auVar152._0_4_;
  auVar152._8_4_ = auVar152._0_4_;
  auVar152._12_4_ = auVar152._0_4_;
  auVar46 = vfmadd231ps_fma(auVar205,auVar152,auVar46);
  auVar165._0_4_ = local_120 * auVar48._0_4_;
  auVar165._4_4_ = local_120 * auVar48._4_4_;
  auVar165._8_4_ = local_120 * auVar48._8_4_;
  auVar165._12_4_ = local_120 * auVar48._12_4_;
  auVar112 = vfmadd231ps_fma(auVar165,auVar152,auVar112);
  auVar166._0_4_ = local_120 * auVar112._0_4_;
  auVar166._4_4_ = local_120 * auVar112._4_4_;
  auVar166._8_4_ = local_120 * auVar112._8_4_;
  auVar166._12_4_ = local_120 * auVar112._12_4_;
  auVar46 = vfmadd231ps_fma(auVar166,auVar152,auVar46);
  auVar21._8_4_ = 0x40400000;
  auVar21._0_8_ = 0x4040000040400000;
  auVar21._12_4_ = 0x40400000;
  auVar46 = vmulps_avx512vl(auVar46,auVar21);
  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar29 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_019ff057;
    auVar143._0_4_ = fVar209 * (float)local_400._0_4_;
    auVar143._4_4_ = fVar209 * (float)local_400._4_4_;
    auVar143._8_4_ = fVar209 * fStack_3f8;
    auVar143._12_4_ = fVar209 * fStack_3f4;
    auVar130._4_4_ = fVar207;
    auVar130._0_4_ = fVar207;
    auVar130._8_4_ = fVar207;
    auVar130._12_4_ = fVar207;
    auVar112 = vfmadd132ps_fma(auVar130,auVar143,local_3f0);
    auVar125._4_4_ = fVar102;
    auVar125._0_4_ = fVar102;
    auVar125._8_4_ = fVar102;
    auVar125._12_4_ = fVar102;
    auVar112 = vfmadd132ps_fma(auVar125,auVar112,local_3e0);
    auVar117._4_4_ = fVar211;
    auVar117._0_4_ = fVar211;
    auVar117._8_4_ = fVar211;
    auVar117._12_4_ = fVar211;
    auVar55 = vfmadd132ps_fma(auVar117,auVar112,local_3d0);
    auVar112 = vshufps_avx(auVar55,auVar55,0xc9);
    auVar48 = vshufps_avx(auVar46,auVar46,0xc9);
    auVar118._0_4_ = auVar55._0_4_ * auVar48._0_4_;
    auVar118._4_4_ = auVar55._4_4_ * auVar48._4_4_;
    auVar118._8_4_ = auVar55._8_4_ * auVar48._8_4_;
    auVar118._12_4_ = auVar55._12_4_ * auVar48._12_4_;
    auVar46 = vfmsub231ps_fma(auVar118,auVar46,auVar112);
    auVar133._8_4_ = 1;
    auVar133._0_8_ = 0x100000001;
    auVar133._12_4_ = 1;
    auVar133._16_4_ = 1;
    auVar133._20_4_ = 1;
    auVar133._24_4_ = 1;
    auVar133._28_4_ = 1;
    local_100 = vpermps_avx2(auVar133,ZEXT1632(auVar44));
    auVar75 = vpermps_avx2(auVar133,ZEXT1632(auVar46));
    local_160 = vpermps_avx512vl(auVar245._0_32_,ZEXT1632(auVar46));
    local_140 = auVar46._0_4_;
    local_180[0] = (RTCHitN)auVar75[0];
    local_180[1] = (RTCHitN)auVar75[1];
    local_180[2] = (RTCHitN)auVar75[2];
    local_180[3] = (RTCHitN)auVar75[3];
    local_180[4] = (RTCHitN)auVar75[4];
    local_180[5] = (RTCHitN)auVar75[5];
    local_180[6] = (RTCHitN)auVar75[6];
    local_180[7] = (RTCHitN)auVar75[7];
    local_180[8] = (RTCHitN)auVar75[8];
    local_180[9] = (RTCHitN)auVar75[9];
    local_180[10] = (RTCHitN)auVar75[10];
    local_180[0xb] = (RTCHitN)auVar75[0xb];
    local_180[0xc] = (RTCHitN)auVar75[0xc];
    local_180[0xd] = (RTCHitN)auVar75[0xd];
    local_180[0xe] = (RTCHitN)auVar75[0xe];
    local_180[0xf] = (RTCHitN)auVar75[0xf];
    local_180[0x10] = (RTCHitN)auVar75[0x10];
    local_180[0x11] = (RTCHitN)auVar75[0x11];
    local_180[0x12] = (RTCHitN)auVar75[0x12];
    local_180[0x13] = (RTCHitN)auVar75[0x13];
    local_180[0x14] = (RTCHitN)auVar75[0x14];
    local_180[0x15] = (RTCHitN)auVar75[0x15];
    local_180[0x16] = (RTCHitN)auVar75[0x16];
    local_180[0x17] = (RTCHitN)auVar75[0x17];
    local_180[0x18] = (RTCHitN)auVar75[0x18];
    local_180[0x19] = (RTCHitN)auVar75[0x19];
    local_180[0x1a] = (RTCHitN)auVar75[0x1a];
    local_180[0x1b] = (RTCHitN)auVar75[0x1b];
    local_180[0x1c] = (RTCHitN)auVar75[0x1c];
    local_180[0x1d] = (RTCHitN)auVar75[0x1d];
    local_180[0x1e] = (RTCHitN)auVar75[0x1e];
    local_180[0x1f] = (RTCHitN)auVar75[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_1e0._0_8_;
    uStack_d8 = local_1e0._8_8_;
    uStack_d0 = local_1e0._16_8_;
    uStack_c8 = local_1e0._24_8_;
    local_c0 = local_200;
    vpcmpeqd_avx2(local_200,local_200);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = auVar50._0_4_;
    local_420 = local_220;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar9->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar9->occlusionFilterN)(&local_450);
      auVar244 = ZEXT3264(_DAT_01fb9fe0);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar243 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar242 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar240 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar239 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar238 = ZEXT1664(auVar44);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar245 = ZEXT3264(auVar75);
    }
    if (local_420 == (undefined1  [32])0x0) {
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar241 = ZEXT3264(auVar75);
      auVar44 = vxorps_avx512vl(auVar64,auVar64);
      auVar246 = ZEXT1664(auVar44);
    }
    else {
      p_Var10 = context->args->filter;
      if (p_Var10 == (RTCFilterFunctionN)0x0) {
        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar241 = ZEXT3264(auVar75);
        auVar44 = vxorps_avx512vl(auVar64,auVar64);
        auVar246 = ZEXT1664(auVar44);
      }
      else {
        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar241 = ZEXT3264(auVar75);
        auVar44 = vxorps_avx512vl(auVar64,auVar64);
        auVar246 = ZEXT1664(auVar44);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var10)(&local_450);
          auVar44 = vxorps_avx512vl(auVar44,auVar44);
          auVar246 = ZEXT1664(auVar44);
          auVar244 = ZEXT3264(_DAT_01fb9fe0);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar243 = ZEXT1664(auVar44);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar242 = ZEXT1664(auVar44);
          auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar241 = ZEXT3264(auVar75);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar240 = ZEXT1664(auVar44);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar239 = ZEXT1664(auVar44);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar238 = ZEXT1664(auVar44);
          auVar75 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar245 = ZEXT3264(auVar75);
        }
      }
      auVar247 = ZEXT464(0x3f800000);
      uVar36 = vptestmd_avx512vl(local_420,local_420);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar42 = (bool)((byte)uVar36 & 1);
      bVar43 = (bool)((byte)(uVar36 >> 1) & 1);
      bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
      bVar41 = (bool)((byte)(uVar36 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar36 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar36 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar36 >> 6) & 1);
      bVar16 = SUB81(uVar36 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar42 * auVar75._0_4_ | (uint)!bVar42 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar43 * auVar75._4_4_ | (uint)!bVar43 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar40 * auVar75._8_4_ | (uint)!bVar40 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar41 * auVar75._12_4_ | (uint)!bVar41 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar13 * auVar75._16_4_ | (uint)!bVar13 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar14 * auVar75._20_4_ | (uint)!bVar14 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar15 * auVar75._24_4_ | (uint)!bVar15 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar16 * auVar75._28_4_ | (uint)!bVar16 * *(int *)(local_450.ray + 0x11c);
      bVar29 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_019ff057;
    }
    auVar247 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x100) = fVar196;
  }
  bVar29 = 0;
LAB_019ff057:
  bVar39 = (bool)(bVar39 | bVar29);
  goto LAB_019fe192;
LAB_019ff06a:
  auVar46 = vinsertps_avx(auVar137,auVar57,0x10);
  goto LAB_019fdc98;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }